

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  byte bVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar31;
  long lVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  int iVar96;
  float fVar97;
  undefined4 uVar98;
  vint4 bi_2;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  vint4 bi_1;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  vint4 bi;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  float fVar122;
  float fVar133;
  float fVar134;
  vfloat4 a0;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar135;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  vint4 ai_2;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  vint4 ai_1;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  vint4 ai;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar205;
  float fVar219;
  float fVar220;
  vfloat4 a0_3;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar221;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar222;
  float fVar223;
  float fVar224;
  vfloat4 b0_2;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  vfloat4 a0_4;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  int iVar265;
  undefined1 in_ZMM31 [64];
  undefined1 auVar266 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  ulong local_3e8;
  Primitive *local_3e0;
  RTCFilterFunctionNArguments local_3d8;
  undefined1 local_3a8 [16];
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  uint auStack_308 [4];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint uStack_148;
  float afStack_144 [7];
  RTCHitN local_128 [16];
  undefined1 local_118 [16];
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  undefined1 local_98 [32];
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong auStack_58 [5];
  ulong uVar30;
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar247 [32];
  
  PVar5 = prim[1];
  uVar28 = (ulong)(byte)PVar5;
  lVar32 = uVar28 * 0x25;
  fVar97 = *(float *)(prim + lVar32 + 0x12);
  auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar39 = vsubps_avx(auVar39,*(undefined1 (*) [16])(prim + lVar32 + 6));
  auVar123._0_4_ = fVar97 * auVar39._0_4_;
  auVar123._4_4_ = fVar97 * auVar39._4_4_;
  auVar123._8_4_ = fVar97 * auVar39._8_4_;
  auVar123._12_4_ = fVar97 * auVar39._12_4_;
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 4 + 6)));
  auVar43._0_4_ = fVar97 * auVar40._0_4_;
  auVar43._4_4_ = fVar97 * auVar40._4_4_;
  auVar43._8_4_ = fVar97 * auVar40._8_4_;
  auVar43._12_4_ = fVar97 * auVar40._12_4_;
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 5 + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 6 + 6)));
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 0xf + 6)));
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar48 = vcvtdq2ps_avx(auVar48);
  auVar53 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + 6)));
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar28 + 6)));
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 0x1a + 6)));
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 0x1b + 6)));
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 0x1c + 6)));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar147._4_4_ = auVar43._0_4_;
  auVar147._0_4_ = auVar43._0_4_;
  auVar147._8_4_ = auVar43._0_4_;
  auVar147._12_4_ = auVar43._0_4_;
  auVar56 = vshufps_avx(auVar43,auVar43,0x55);
  auVar57 = vshufps_avx(auVar43,auVar43,0xaa);
  fVar97 = auVar57._0_4_;
  auVar114._0_4_ = fVar97 * auVar41._0_4_;
  fVar224 = auVar57._4_4_;
  auVar114._4_4_ = fVar224 * auVar41._4_4_;
  fVar205 = auVar57._8_4_;
  auVar114._8_4_ = fVar205 * auVar41._8_4_;
  fVar219 = auVar57._12_4_;
  auVar114._12_4_ = fVar219 * auVar41._12_4_;
  auVar54._0_4_ = auVar50._0_4_ * fVar97;
  auVar54._4_4_ = auVar50._4_4_ * fVar224;
  auVar54._8_4_ = auVar50._8_4_ * fVar205;
  auVar54._12_4_ = auVar50._12_4_ * fVar219;
  auVar44._0_4_ = auVar55._0_4_ * fVar97;
  auVar44._4_4_ = auVar55._4_4_ * fVar224;
  auVar44._8_4_ = auVar55._8_4_ * fVar205;
  auVar44._12_4_ = auVar55._12_4_ * fVar219;
  auVar57 = vfmadd231ps_fma(auVar114,auVar56,auVar40);
  auVar61 = vfmadd231ps_fma(auVar54,auVar56,auVar53);
  auVar56 = vfmadd231ps_fma(auVar44,auVar52,auVar56);
  auVar59 = vfmadd231ps_fma(auVar57,auVar147,auVar39);
  auVar61 = vfmadd231ps_fma(auVar61,auVar147,auVar48);
  auVar60 = vfmadd231ps_fma(auVar56,auVar51,auVar147);
  auVar248._4_4_ = auVar123._0_4_;
  auVar248._0_4_ = auVar123._0_4_;
  auVar248._8_4_ = auVar123._0_4_;
  auVar248._12_4_ = auVar123._0_4_;
  auVar56 = vshufps_avx(auVar123,auVar123,0x55);
  auVar57 = vshufps_avx(auVar123,auVar123,0xaa);
  fVar97 = auVar57._0_4_;
  auVar148._0_4_ = fVar97 * auVar41._0_4_;
  fVar224 = auVar57._4_4_;
  auVar148._4_4_ = fVar224 * auVar41._4_4_;
  fVar205 = auVar57._8_4_;
  auVar148._8_4_ = fVar205 * auVar41._8_4_;
  fVar219 = auVar57._12_4_;
  auVar148._12_4_ = fVar219 * auVar41._12_4_;
  auVar136._0_4_ = auVar50._0_4_ * fVar97;
  auVar136._4_4_ = auVar50._4_4_ * fVar224;
  auVar136._8_4_ = auVar50._8_4_ * fVar205;
  auVar136._12_4_ = auVar50._12_4_ * fVar219;
  auVar124._0_4_ = auVar55._0_4_ * fVar97;
  auVar124._4_4_ = auVar55._4_4_ * fVar224;
  auVar124._8_4_ = auVar55._8_4_ * fVar205;
  auVar124._12_4_ = auVar55._12_4_ * fVar219;
  auVar40 = vfmadd231ps_fma(auVar148,auVar56,auVar40);
  auVar41 = vfmadd231ps_fma(auVar136,auVar56,auVar53);
  auVar53 = vfmadd231ps_fma(auVar124,auVar56,auVar52);
  auVar42 = vfmadd231ps_fma(auVar40,auVar248,auVar39);
  auVar43 = vfmadd231ps_fma(auVar41,auVar248,auVar48);
  auVar80._16_16_ = in_YmmResult._16_16_;
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar262 = ZEXT1664(auVar39);
  auVar44 = vfmadd231ps_fma(auVar53,auVar248,auVar51);
  auVar40 = vandps_avx512vl(auVar59,auVar39);
  auVar174._8_4_ = 0x219392ef;
  auVar174._0_8_ = 0x219392ef219392ef;
  auVar174._12_4_ = 0x219392ef;
  uVar37 = vcmpps_avx512vl(auVar40,auVar174,1);
  bVar13 = (bool)((byte)uVar37 & 1);
  auVar45._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar59._0_4_;
  bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar45._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar59._4_4_;
  bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar45._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar59._8_4_;
  bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar45._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar59._12_4_;
  auVar40 = vandps_avx512vl(auVar61,auVar39);
  uVar37 = vcmpps_avx512vl(auVar40,auVar174,1);
  bVar13 = (bool)((byte)uVar37 & 1);
  auVar46._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar61._0_4_;
  bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar61._4_4_;
  bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar61._8_4_;
  bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar46._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar61._12_4_;
  auVar39 = vandps_avx512vl(auVar60,auVar39);
  uVar37 = vcmpps_avx512vl(auVar39,auVar174,1);
  bVar13 = (bool)((byte)uVar37 & 1);
  auVar47._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar60._0_4_;
  bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar47._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar60._4_4_;
  bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar47._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar60._8_4_;
  bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar47._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar60._12_4_;
  auVar39 = vrcp14ps_avx512vl(auVar45);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar263 = ZEXT1664(auVar40);
  auVar41 = vfnmadd213ps_avx512vl(auVar45,auVar39,auVar40);
  auVar59 = vfmadd132ps_fma(auVar41,auVar39,auVar39);
  auVar39 = vrcp14ps_avx512vl(auVar46);
  auVar41 = vfnmadd213ps_avx512vl(auVar46,auVar39,auVar40);
  auVar60 = vfmadd132ps_fma(auVar41,auVar39,auVar39);
  auVar39 = vrcp14ps_avx512vl(auVar47);
  auVar40 = vfnmadd213ps_avx512vl(auVar47,auVar39,auVar40);
  auVar58 = vfmadd132ps_fma(auVar40,auVar39,auVar39);
  fVar97 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar32 + 0x16)) *
           *(float *)(prim + lVar32 + 0x1a);
  auVar160._4_4_ = fVar97;
  auVar160._0_4_ = fVar97;
  auVar160._8_4_ = fVar97;
  auVar160._12_4_ = fVar97;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar28 * 7 + 6);
  auVar39 = vpmovsxwd_avx(auVar39);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar28 * 0xb + 6);
  auVar40 = vpmovsxwd_avx(auVar40);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar48 = vsubps_avx(auVar40,auVar39);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar28 * 9 + 6);
  auVar40 = vpmovsxwd_avx(auVar41);
  auVar41 = vfmadd213ps_fma(auVar48,auVar160,auVar39);
  auVar39 = vcvtdq2ps_avx(auVar40);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar28 * 0xd + 6);
  auVar40 = vpmovsxwd_avx(auVar48);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar48 = vfmadd213ps_fma(auVar40,auVar160,auVar39);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar28 * 0x12 + 6);
  auVar39 = vpmovsxwd_avx(auVar53);
  auVar39 = vcvtdq2ps_avx(auVar39);
  uVar37 = (ulong)(uint)((int)(uVar28 * 5) << 2);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar28 * 2 + uVar37 + 6);
  auVar40 = vpmovsxwd_avx(auVar50);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar53 = vfmadd213ps_fma(auVar40,auVar160,auVar39);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar37 + 6);
  auVar39 = vpmovsxwd_avx(auVar51);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar28 * 0x18 + 6);
  auVar40 = vpmovsxwd_avx(auVar52);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar50 = vfmadd213ps_fma(auVar40,auVar160,auVar39);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar28 * 0x1d + 6);
  auVar39 = vpmovsxwd_avx(auVar55);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar28 + (ulong)(byte)PVar5 * 0x20 + 6);
  auVar40 = vpmovsxwd_avx(auVar56);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar51 = vfmadd213ps_fma(auVar40,auVar160,auVar39);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar5 * 0x20 - uVar28) + 6);
  auVar39 = vpmovsxwd_avx(auVar57);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar28 * 0x23 + 6);
  auVar40 = vpmovsxwd_avx(auVar61);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar40 = vfmadd213ps_fma(auVar40,auVar160,auVar39);
  auVar39 = vsubps_avx(auVar41,auVar42);
  auVar161._0_4_ = auVar59._0_4_ * auVar39._0_4_;
  auVar161._4_4_ = auVar59._4_4_ * auVar39._4_4_;
  auVar161._8_4_ = auVar59._8_4_ * auVar39._8_4_;
  auVar161._12_4_ = auVar59._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar48,auVar42);
  auVar115._0_4_ = auVar59._0_4_ * auVar39._0_4_;
  auVar115._4_4_ = auVar59._4_4_ * auVar39._4_4_;
  auVar115._8_4_ = auVar59._8_4_ * auVar39._8_4_;
  auVar115._12_4_ = auVar59._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar53,auVar43);
  auVar149._0_4_ = auVar60._0_4_ * auVar39._0_4_;
  auVar149._4_4_ = auVar60._4_4_ * auVar39._4_4_;
  auVar149._8_4_ = auVar60._8_4_ * auVar39._8_4_;
  auVar149._12_4_ = auVar60._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar50,auVar43);
  auVar103._0_4_ = auVar60._0_4_ * auVar39._0_4_;
  auVar103._4_4_ = auVar60._4_4_ * auVar39._4_4_;
  auVar103._8_4_ = auVar60._8_4_ * auVar39._8_4_;
  auVar103._12_4_ = auVar60._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar51,auVar44);
  auVar137._0_4_ = auVar58._0_4_ * auVar39._0_4_;
  auVar137._4_4_ = auVar58._4_4_ * auVar39._4_4_;
  auVar137._8_4_ = auVar58._8_4_ * auVar39._8_4_;
  auVar137._12_4_ = auVar58._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar40,auVar44);
  auVar49._0_4_ = auVar58._0_4_ * auVar39._0_4_;
  auVar49._4_4_ = auVar58._4_4_ * auVar39._4_4_;
  auVar49._8_4_ = auVar58._8_4_ * auVar39._8_4_;
  auVar49._12_4_ = auVar58._12_4_ * auVar39._12_4_;
  auVar39 = vpminsd_avx(auVar161,auVar115);
  auVar40 = vpminsd_avx(auVar149,auVar103);
  auVar39 = vmaxps_avx(auVar39,auVar40);
  auVar40 = vpminsd_avx(auVar137,auVar49);
  uVar98 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar59._4_4_ = uVar98;
  auVar59._0_4_ = uVar98;
  auVar59._8_4_ = uVar98;
  auVar59._12_4_ = uVar98;
  auVar40 = vmaxps_avx512vl(auVar40,auVar59);
  auVar39 = vmaxps_avx(auVar39,auVar40);
  auVar60._8_4_ = 0x3f7ffffa;
  auVar60._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar60._12_4_ = 0x3f7ffffa;
  local_2c8 = vmulps_avx512vl(auVar39,auVar60);
  auVar39 = vpmaxsd_avx(auVar161,auVar115);
  auVar40 = vpmaxsd_avx(auVar149,auVar103);
  auVar39 = vminps_avx(auVar39,auVar40);
  auVar40 = vpmaxsd_avx(auVar137,auVar49);
  uVar98 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar58._4_4_ = uVar98;
  auVar58._0_4_ = uVar98;
  auVar58._8_4_ = uVar98;
  auVar58._12_4_ = uVar98;
  auVar40 = vminps_avx512vl(auVar40,auVar58);
  auVar39 = vminps_avx(auVar39,auVar40);
  auVar42._8_4_ = 0x3f800003;
  auVar42._0_8_ = 0x3f8000033f800003;
  auVar42._12_4_ = 0x3f800003;
  auVar39 = vmulps_avx512vl(auVar39,auVar42);
  auVar40 = vpbroadcastd_avx512vl();
  uVar17 = vcmpps_avx512vl(local_2c8,auVar39,2);
  uVar37 = vpcmpgtd_avx512vl(auVar40,_DAT_01ff0cf0);
  uVar37 = ((byte)uVar17 & 0xf) & uVar37;
  if ((char)uVar37 == '\0') {
    return;
  }
  local_2f8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar39 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar266 = ZEXT1664(auVar39);
  auVar80._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar261 = ZEXT1664(auVar80._0_16_);
  local_3e0 = prim;
LAB_01c1fcfc:
  lVar32 = 0;
  for (uVar28 = uVar37; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
    lVar32 = lVar32 + 1;
  }
  uVar28 = (ulong)*(uint *)(local_3e0 + 2);
  pGVar7 = (context->scene->geometries).items[uVar28].ptr;
  fVar97 = (pGVar7->time_range).lower;
  fVar97 = pGVar7->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar97) / ((pGVar7->time_range).upper - fVar97));
  auVar39 = vroundss_avx(ZEXT416((uint)fVar97),ZEXT416((uint)fVar97),9);
  uVar33 = *(uint *)(local_3e0 + lVar32 * 4 + 6);
  auVar39 = vminss_avx(auVar39,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar76._16_16_ = auVar80._16_16_;
  auVar42 = vmaxss_avx512f(auVar266._0_16_,auVar39);
  uVar29 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)uVar33 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar31 = (long)(int)auVar42._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar31);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar31);
  auVar39 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar29);
  lVar32 = uVar29 + 1;
  auVar40 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar32);
  lVar1 = uVar29 + 2;
  auVar41 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar29 + 3;
  auVar48 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar31);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar31);
  auVar53 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar29);
  auVar50 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar32);
  auVar51 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar52 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar31);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar31);
  auVar55 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar29);
  auVar56 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar32);
  auVar57 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar61 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)(lVar9 + 0x38 + lVar31);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar31);
  auVar59 = *(undefined1 (*) [16])(lVar10 + uVar29 * lVar9);
  auVar60 = *(undefined1 (*) [16])(lVar10 + lVar32 * lVar9);
  auVar58 = *(undefined1 (*) [16])(lVar10 + lVar1 * lVar9);
  auVar42 = vsubss_avx512f(ZEXT416((uint)fVar97),auVar42);
  auVar76._0_16_ = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
  auVar43 = vmulps_avx512vl(auVar48,auVar76._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar41,auVar76._0_16_);
  auVar44 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar40,auVar43);
  auVar44 = vaddps_avx512vl(auVar39,auVar44);
  auVar103 = auVar261._0_16_;
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar40,auVar103);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar39,auVar103);
  auVar45 = vmulps_avx512vl(auVar52,auVar76._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar51,auVar76._0_16_);
  auVar46 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar46 = vfmadd213ps_avx512vl(auVar46,auVar50,auVar45);
  auVar47 = vaddps_avx512vl(auVar53,auVar46);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar50,auVar103);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar53,auVar103);
  auVar46 = vxorps_avx512vl(auVar46,auVar46);
  auVar46 = vfmadd213ps_avx512vl(auVar46,auVar41,auVar48);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar40,auVar76._0_16_);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar39,auVar76._0_16_);
  auVar48 = vmulps_avx512vl(auVar48,auVar103);
  auVar41 = vfnmadd231ps_avx512vl(auVar48,auVar103,auVar41);
  auVar40 = vfmadd231ps_avx512vl(auVar41,auVar76._0_16_,auVar40);
  auVar80._16_16_ = vfnmadd231ps_avx512vl(auVar40,auVar76._0_16_,auVar39);
  auVar39 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar51,auVar52);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar50,auVar76._0_16_);
  auVar49 = vfmadd231ps_avx512vl(auVar39,auVar53,auVar76._0_16_);
  auVar39 = vmulps_avx512vl(auVar52,auVar103);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar103,auVar51);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar76._0_16_,auVar50);
  auVar50 = vfnmadd231ps_avx512vl(auVar39,auVar76._0_16_,auVar53);
  auVar40 = vshufps_avx512vl(auVar43,auVar43,0xc9);
  auVar39 = vshufps_avx512vl(auVar47,auVar47,0xc9);
  auVar39 = vmulps_avx512vl(auVar43,auVar39);
  auVar39 = vfmsub231ps_avx512vl(auVar39,auVar40,auVar47);
  auVar41 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar39 = vmulps_avx512vl(auVar43,auVar39);
  auVar39 = vfmsub231ps_fma(auVar39,auVar40,auVar45);
  auVar48 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx(auVar80._16_16_,auVar80._16_16_,0xc9);
  auVar40 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar162._0_4_ = auVar80._16_4_ * auVar40._0_4_;
  auVar162._4_4_ = auVar80._20_4_ * auVar40._4_4_;
  auVar162._8_4_ = auVar80._24_4_ * auVar40._8_4_;
  auVar162._12_4_ = auVar80._28_4_ * auVar40._12_4_;
  auVar40 = vfmsub231ps_fma(auVar162,auVar39,auVar49);
  auVar53 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar163._0_4_ = auVar80._16_4_ * auVar40._0_4_;
  auVar163._4_4_ = auVar80._20_4_ * auVar40._4_4_;
  auVar163._8_4_ = auVar80._24_4_ * auVar40._8_4_;
  auVar163._12_4_ = auVar80._28_4_ * auVar40._12_4_;
  auVar39 = vfmsub231ps_fma(auVar163,auVar39,auVar50);
  auVar50 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vdpps_avx(auVar41,auVar41,0x7f);
  auVar62._4_28_ = auVar76._4_28_;
  auVar62._0_4_ = auVar39._0_4_;
  auVar40 = vrsqrt14ss_avx512f(auVar76._0_16_,auVar62._0_16_);
  auVar51 = vmulss_avx512f(auVar40,ZEXT416(0x3fc00000));
  auVar52 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  auVar52 = vmulss_avx512f(auVar52,auVar40);
  auVar40 = vmulss_avx512f(auVar52,ZEXT416((uint)(auVar40._0_4_ * auVar40._0_4_)));
  fVar205 = auVar51._0_4_ - auVar40._0_4_;
  auVar185._4_4_ = fVar205;
  auVar185._0_4_ = fVar205;
  auVar185._8_4_ = fVar205;
  auVar185._12_4_ = fVar205;
  auVar40 = vdpps_avx(auVar41,auVar48,0x7f);
  auVar51 = vmulps_avx512vl(auVar41,auVar185);
  auVar52 = vbroadcastss_avx512vl(auVar39);
  auVar48 = vmulps_avx512vl(auVar52,auVar48);
  fVar97 = auVar40._0_4_;
  auVar150._0_4_ = fVar97 * auVar41._0_4_;
  auVar150._4_4_ = fVar97 * auVar41._4_4_;
  auVar150._8_4_ = fVar97 * auVar41._8_4_;
  auVar150._12_4_ = fVar97 * auVar41._12_4_;
  auVar41 = vsubps_avx(auVar48,auVar150);
  auVar40 = vrcp14ss_avx512f(auVar76._0_16_,auVar62._0_16_);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar40,ZEXT416(0x40000000));
  fVar97 = auVar40._0_4_ * auVar39._0_4_;
  auVar39 = vdpps_avx(auVar53,auVar53,0x7f);
  auVar78._16_16_ = auVar76._16_16_;
  auVar78._0_16_ = auVar76._0_16_;
  auVar79._4_28_ = auVar78._4_28_;
  auVar79._0_4_ = auVar39._0_4_;
  auVar40 = vrsqrt14ss_avx512f(auVar76._0_16_,auVar79._0_16_);
  auVar48 = vmulss_avx512f(auVar40,ZEXT416(0x3fc00000));
  auVar52 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  fVar224 = auVar40._0_4_;
  fVar219 = auVar48._0_4_ - auVar52._0_4_ * fVar224 * fVar224 * fVar224;
  auVar186._0_4_ = auVar53._0_4_ * fVar219;
  auVar186._4_4_ = auVar53._4_4_ * fVar219;
  auVar186._8_4_ = auVar53._8_4_ * fVar219;
  auVar186._12_4_ = auVar53._12_4_ * fVar219;
  auVar40 = vdpps_avx(auVar53,auVar50,0x7f);
  auVar48 = vbroadcastss_avx512vl(auVar39);
  auVar48 = vmulps_avx512vl(auVar48,auVar50);
  fVar224 = auVar40._0_4_;
  auVar104._0_4_ = fVar224 * auVar53._0_4_;
  auVar104._4_4_ = fVar224 * auVar53._4_4_;
  auVar104._8_4_ = fVar224 * auVar53._8_4_;
  auVar104._12_4_ = fVar224 * auVar53._12_4_;
  auVar40 = vsubps_avx(auVar48,auVar104);
  auVar48 = vrcp14ss_avx512f(auVar76._0_16_,auVar79._0_16_);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar48,ZEXT416(0x40000000));
  fVar224 = auVar48._0_4_ * auVar39._0_4_;
  auVar39 = vshufps_avx512vl(auVar44,auVar44,0xff);
  auVar48 = vmulps_avx512vl(auVar39,auVar51);
  auVar45 = vsubps_avx512vl(auVar44,auVar48);
  auVar53 = vshufps_avx512vl(auVar43,auVar43,0xff);
  auVar53 = vmulps_avx512vl(auVar53,auVar51);
  auVar138._0_4_ = auVar53._0_4_ + auVar39._0_4_ * fVar205 * fVar97 * auVar41._0_4_;
  auVar138._4_4_ = auVar53._4_4_ + auVar39._4_4_ * fVar205 * fVar97 * auVar41._4_4_;
  auVar138._8_4_ = auVar53._8_4_ + auVar39._8_4_ * fVar205 * fVar97 * auVar41._8_4_;
  auVar138._12_4_ = auVar53._12_4_ + auVar39._12_4_ * fVar205 * fVar97 * auVar41._12_4_;
  auVar41 = vsubps_avx512vl(auVar43,auVar138);
  auVar44 = vaddps_avx512vl(auVar44,auVar48);
  auVar48 = vaddps_avx512vl(auVar43,auVar138);
  auVar39 = vshufps_avx512vl(auVar46,auVar46,0xff);
  auVar53 = vmulps_avx512vl(auVar39,auVar186);
  auVar43 = vsubps_avx512vl(auVar46,auVar53);
  auVar50 = vshufps_avx512vl(auVar80._16_16_,auVar80._16_16_,0xff);
  auVar51 = vmulps_avx512vl(auVar50,auVar186);
  auVar187._0_4_ = auVar51._0_4_ + auVar39._0_4_ * fVar219 * auVar40._0_4_ * fVar224;
  auVar187._4_4_ = auVar51._4_4_ + auVar39._4_4_ * fVar219 * auVar40._4_4_ * fVar224;
  auVar187._8_4_ = auVar51._8_4_ + auVar39._8_4_ * fVar219 * auVar40._8_4_ * fVar224;
  auVar187._12_4_ = auVar51._12_4_ + auVar39._12_4_ * fVar219 * auVar40._12_4_ * fVar224;
  auVar39 = vsubps_avx(auVar80._16_16_,auVar187);
  auVar46 = vaddps_avx512vl(auVar46,auVar53);
  auVar40 = vaddps_avx512vl(auVar80._16_16_,auVar187);
  auVar99._8_4_ = 0x3eaaaaab;
  auVar99._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar99._12_4_ = 0x3eaaaaab;
  auVar175._0_4_ = auVar45._0_4_ + auVar41._0_4_ * 0.33333334;
  auVar175._4_4_ = auVar45._4_4_ + auVar41._4_4_ * 0.33333334;
  auVar175._8_4_ = auVar45._8_4_ + auVar41._8_4_ * 0.33333334;
  auVar175._12_4_ = auVar45._12_4_ + auVar41._12_4_ * 0.33333334;
  auVar164._0_4_ = auVar39._0_4_ * 0.33333334;
  auVar164._4_4_ = auVar39._4_4_ * 0.33333334;
  auVar164._8_4_ = auVar39._8_4_ * 0.33333334;
  auVar164._12_4_ = auVar39._12_4_ * 0.33333334;
  auVar51 = vsubps_avx(auVar43,auVar164);
  auVar151._0_4_ = auVar48._0_4_ * 0.33333334;
  auVar151._4_4_ = auVar48._4_4_ * 0.33333334;
  auVar151._8_4_ = auVar48._8_4_ * 0.33333334;
  auVar151._12_4_ = auVar48._12_4_ * 0.33333334;
  auVar47 = vaddps_avx512vl(auVar44,auVar151);
  auVar39 = vmulps_avx512vl(auVar40,auVar99);
  auVar52 = vsubps_avx(auVar46,auVar39);
  auVar39 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar2);
  auVar41 = vmulps_avx512vl(auVar61,auVar76._0_16_);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar57,auVar76._0_16_);
  auVar40 = vxorps_avx512vl(auVar40,auVar40);
  auVar40 = vfmadd213ps_avx512vl(auVar40,auVar56,auVar41);
  auVar80._16_16_ = vaddps_avx512vl(auVar55,auVar40);
  auVar40 = vfmadd231ps_avx512vl(auVar41,auVar56,auVar103);
  auVar49 = vfnmadd231ps_avx512vl(auVar40,auVar55,auVar103);
  auVar40 = vmulps_avx512vl(auVar39,auVar76._0_16_);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar58,auVar76._0_16_);
  auVar41 = vxorps_avx512vl(auVar50,auVar50);
  auVar41 = vfmadd213ps_avx512vl(auVar41,auVar60,auVar40);
  auVar48 = vaddps_avx512vl(auVar59,auVar41);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar60,auVar103);
  auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar59,auVar103);
  auVar41 = vxorps_avx512vl(auVar41,auVar41);
  auVar41 = vfmadd213ps_avx512vl(auVar41,auVar57,auVar61);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar56,auVar76._0_16_);
  auVar54 = vfmadd231ps_avx512vl(auVar41,auVar55,auVar76._0_16_);
  auVar41 = vmulps_avx512vl(auVar61,auVar103);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar103,auVar57);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar76._0_16_,auVar56);
  auVar55 = vfnmadd231ps_avx512vl(auVar41,auVar76._0_16_,auVar55);
  auVar41 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar58,auVar39);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar60,auVar76._0_16_);
  auVar53 = vfmadd231ps_avx512vl(auVar41,auVar59,auVar76._0_16_);
  auVar39 = vmulps_avx512vl(auVar39,auVar103);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar103,auVar58);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar76._0_16_,auVar60);
  auVar50 = vfnmadd231ps_avx512vl(auVar39,auVar76._0_16_,auVar59);
  auVar39 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar41 = vshufps_avx512vl(auVar48,auVar48,0xc9);
  fVar219 = auVar49._0_4_;
  auVar231._0_4_ = fVar219 * auVar41._0_4_;
  fVar220 = auVar49._4_4_;
  auVar231._4_4_ = fVar220 * auVar41._4_4_;
  fVar221 = auVar49._8_4_;
  auVar231._8_4_ = fVar221 * auVar41._8_4_;
  fVar222 = auVar49._12_4_;
  auVar231._12_4_ = fVar222 * auVar41._12_4_;
  auVar41 = vfmsub231ps_avx512vl(auVar231,auVar39,auVar48);
  auVar41 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar48 = vshufps_avx512vl(auVar40,auVar40,0xc9);
  auVar239._0_4_ = fVar219 * auVar48._0_4_;
  auVar239._4_4_ = fVar220 * auVar48._4_4_;
  auVar239._8_4_ = fVar221 * auVar48._8_4_;
  auVar239._12_4_ = fVar222 * auVar48._12_4_;
  auVar39 = vfmsub231ps_avx512vl(auVar239,auVar39,auVar40);
  auVar48 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar56 = vshufps_avx512vl(auVar55,auVar55,0xc9);
  auVar39 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar39 = vmulps_avx512vl(auVar55,auVar39);
  auVar39 = vfmsub231ps_fma(auVar39,auVar56,auVar53);
  auVar53 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar40 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar39 = vdpps_avx(auVar41,auVar41,0x7f);
  auVar40 = vmulps_avx512vl(auVar55,auVar40);
  auVar40 = vfmsub231ps_fma(auVar40,auVar56,auVar50);
  auVar50 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar63._16_16_ = auVar76._16_16_;
  auVar63._0_16_ = auVar76._0_16_;
  auVar64._4_28_ = auVar63._4_28_;
  auVar64._0_4_ = auVar39._0_4_;
  auVar40 = vrsqrt14ss_avx512f(auVar76._0_16_,auVar64._0_16_);
  auVar56 = vmulss_avx512f(auVar40,ZEXT416(0x3fc00000));
  auVar57 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  auVar57 = vmulss_avx512f(auVar57,auVar40);
  auVar40 = vmulss_avx512f(auVar57,ZEXT416((uint)(auVar40._0_4_ * auVar40._0_4_)));
  auVar40 = vsubss_avx512f(auVar56,auVar40);
  auVar255._0_4_ = auVar40._0_4_;
  auVar255._4_4_ = auVar255._0_4_;
  auVar255._8_4_ = auVar255._0_4_;
  auVar255._12_4_ = auVar255._0_4_;
  auVar56 = vmulps_avx512vl(auVar41,auVar255);
  auVar40 = vdpps_avx(auVar41,auVar48,0x7f);
  auVar57 = vbroadcastss_avx512vl(auVar39);
  auVar48 = vmulps_avx512vl(auVar57,auVar48);
  fVar97 = auVar40._0_4_;
  auVar165._0_4_ = auVar41._0_4_ * fVar97;
  auVar165._4_4_ = auVar41._4_4_ * fVar97;
  auVar165._8_4_ = auVar41._8_4_ * fVar97;
  auVar165._12_4_ = auVar41._12_4_ * fVar97;
  auVar41 = vsubps_avx(auVar48,auVar165);
  auVar40 = vrcp14ss_avx512f(auVar76._0_16_,auVar64._0_16_);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar40,ZEXT416(0x40000000));
  fVar97 = auVar40._0_4_ * auVar39._0_4_;
  auVar39 = vdpps_avx(auVar53,auVar53,0x7f);
  auVar66._16_16_ = auVar76._16_16_;
  auVar66._0_16_ = auVar76._0_16_;
  auVar65._4_28_ = auVar66._4_28_;
  auVar65._0_4_ = auVar39._0_4_;
  auVar40 = vrsqrt14ss_avx512f(auVar76._0_16_,auVar65._0_16_);
  auVar48 = vmulss_avx512f(auVar40,ZEXT416(0x3fc00000));
  auVar57 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  fVar224 = auVar40._0_4_;
  fVar205 = auVar48._0_4_ - auVar57._0_4_ * fVar224 * fVar224 * fVar224;
  auVar249._0_4_ = auVar53._0_4_ * fVar205;
  auVar249._4_4_ = auVar53._4_4_ * fVar205;
  auVar249._8_4_ = auVar53._8_4_ * fVar205;
  auVar249._12_4_ = auVar53._12_4_ * fVar205;
  auVar40 = vdpps_avx(auVar53,auVar50,0x7f);
  auVar48 = vbroadcastss_avx512vl(auVar39);
  auVar48 = vmulps_avx512vl(auVar48,auVar50);
  fVar224 = auVar40._0_4_;
  auVar206._0_4_ = auVar53._0_4_ * fVar224;
  auVar206._4_4_ = auVar53._4_4_ * fVar224;
  auVar206._8_4_ = auVar53._8_4_ * fVar224;
  auVar206._12_4_ = auVar53._12_4_ * fVar224;
  auVar40 = vsubps_avx(auVar48,auVar206);
  auVar48 = vrcp14ss_avx512f(auVar76._0_16_,auVar65._0_16_);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar48,ZEXT416(0x40000000));
  auVar264 = ZEXT464(0x3f800000);
  fVar224 = auVar39._0_4_ * auVar48._0_4_;
  auVar48 = vshufps_avx512vl(auVar80._16_16_,auVar80._16_16_,0xff);
  auVar53 = vmulps_avx512vl(auVar48,auVar56);
  auVar50 = vsubps_avx512vl(auVar80._16_16_,auVar53);
  auVar39 = vshufps_avx(auVar49,auVar49,0xff);
  auVar39 = vmulps_avx512vl(auVar39,auVar56);
  auVar152._0_4_ = auVar39._0_4_ + auVar48._0_4_ * auVar255._0_4_ * fVar97 * auVar41._0_4_;
  auVar152._4_4_ = auVar39._4_4_ + auVar48._4_4_ * auVar255._0_4_ * fVar97 * auVar41._4_4_;
  auVar152._8_4_ = auVar39._8_4_ + auVar48._8_4_ * auVar255._0_4_ * fVar97 * auVar41._8_4_;
  auVar152._12_4_ = auVar39._12_4_ + auVar48._12_4_ * auVar255._0_4_ * fVar97 * auVar41._12_4_;
  auVar39 = vsubps_avx(auVar49,auVar152);
  auVar41 = vaddps_avx512vl(auVar80._16_16_,auVar53);
  auVar48 = vshufps_avx512vl(auVar54,auVar54,0xff);
  auVar240._0_4_ = auVar48._0_4_ * auVar249._0_4_;
  auVar240._4_4_ = auVar48._4_4_ * auVar249._4_4_;
  auVar240._8_4_ = auVar48._8_4_ * auVar249._8_4_;
  auVar240._12_4_ = auVar48._12_4_ * auVar249._12_4_;
  auVar53 = vsubps_avx512vl(auVar54,auVar240);
  auVar56 = vshufps_avx512vl(auVar55,auVar55,0xff);
  auVar56 = vmulps_avx512vl(auVar56,auVar249);
  auVar166._0_4_ = auVar56._0_4_ + auVar48._0_4_ * fVar205 * auVar40._0_4_ * fVar224;
  auVar166._4_4_ = auVar56._4_4_ + auVar48._4_4_ * fVar205 * auVar40._4_4_ * fVar224;
  auVar166._8_4_ = auVar56._8_4_ + auVar48._8_4_ * fVar205 * auVar40._8_4_ * fVar224;
  auVar166._12_4_ = auVar56._12_4_ + auVar48._12_4_ * fVar205 * auVar40._12_4_ * fVar224;
  auVar40 = vsubps_avx512vl(auVar55,auVar166);
  auVar48 = vaddps_avx512vl(auVar54,auVar240);
  auVar55 = vaddps_avx512vl(auVar55,auVar166);
  auVar207._0_4_ = auVar50._0_4_ + auVar39._0_4_ * 0.33333334;
  auVar207._4_4_ = auVar50._4_4_ + auVar39._4_4_ * 0.33333334;
  auVar207._8_4_ = auVar50._8_4_ + auVar39._8_4_ * 0.33333334;
  auVar207._12_4_ = auVar50._12_4_ + auVar39._12_4_ * 0.33333334;
  auVar198._0_4_ = auVar40._0_4_ * 0.33333334;
  auVar198._4_4_ = auVar40._4_4_ * 0.33333334;
  auVar198._8_4_ = auVar40._8_4_ * 0.33333334;
  auVar198._12_4_ = auVar40._12_4_ * 0.33333334;
  auVar39 = vsubps_avx(auVar53,auVar198);
  auVar153._0_4_ = auVar41._0_4_ + (fVar219 + auVar152._0_4_) * 0.33333334;
  auVar153._4_4_ = auVar41._4_4_ + (fVar220 + auVar152._4_4_) * 0.33333334;
  auVar153._8_4_ = auVar41._8_4_ + (fVar221 + auVar152._8_4_) * 0.33333334;
  auVar153._12_4_ = auVar41._12_4_ + (fVar222 + auVar152._12_4_) * 0.33333334;
  auVar167._0_4_ = auVar55._0_4_ * 0.33333334;
  auVar167._4_4_ = auVar55._4_4_ * 0.33333334;
  auVar167._8_4_ = auVar55._8_4_ * 0.33333334;
  auVar167._12_4_ = auVar55._12_4_ * 0.33333334;
  auVar40 = vsubps_avx(auVar48,auVar167);
  auVar55 = vbroadcastss_avx512vl(auVar42);
  auVar56 = vsubss_avx512f(ZEXT416(0x3f800000),auVar42);
  auVar100._0_4_ = auVar56._0_4_;
  auVar100._4_4_ = auVar100._0_4_;
  auVar100._8_4_ = auVar100._0_4_;
  auVar100._12_4_ = auVar100._0_4_;
  auVar50 = vmulps_avx512vl(auVar55,auVar50);
  auVar56 = vmulps_avx512vl(auVar55,auVar207);
  auVar39 = vmulps_avx512vl(auVar55,auVar39);
  auVar256._0_4_ = auVar55._0_4_ * auVar53._0_4_;
  auVar256._4_4_ = auVar55._4_4_ * auVar53._4_4_;
  auVar256._8_4_ = auVar55._8_4_ * auVar53._8_4_;
  auVar256._12_4_ = auVar55._12_4_ * auVar53._12_4_;
  local_208 = vfmadd231ps_avx512vl(auVar50,auVar100,auVar45);
  local_218 = vfmadd231ps_avx512vl(auVar56,auVar100,auVar175);
  local_228 = vfmadd231ps_avx512vl(auVar39,auVar100,auVar51);
  local_238 = vfmadd231ps_fma(auVar256,auVar100,auVar43);
  auVar39 = vmulps_avx512vl(auVar55,auVar41);
  auVar41 = vmulps_avx512vl(auVar55,auVar153);
  auVar40 = vmulps_avx512vl(auVar55,auVar40);
  auVar241._0_4_ = auVar55._0_4_ * auVar48._0_4_;
  auVar241._4_4_ = auVar55._4_4_ * auVar48._4_4_;
  auVar241._8_4_ = auVar55._8_4_ * auVar48._8_4_;
  auVar241._12_4_ = auVar55._12_4_ * auVar48._12_4_;
  _local_248 = vfmadd231ps_avx512vl(auVar39,auVar100,auVar44);
  _local_258 = vfmadd231ps_avx512vl(auVar41,auVar100,auVar47);
  _local_268 = vfmadd231ps_avx512vl(auVar40,auVar100,auVar52);
  _local_278 = vfmadd231ps_fma(auVar241,auVar100,auVar46);
  auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar97 = *(float *)(ray + k * 4 + 0x30);
  local_188 = vsubps_avx512vl(local_208,auVar39);
  uVar98 = local_188._0_4_;
  auVar105._4_4_ = uVar98;
  auVar105._0_4_ = uVar98;
  auVar105._8_4_ = uVar98;
  auVar105._12_4_ = uVar98;
  auVar40 = vshufps_avx(local_188,local_188,0x55);
  auVar41 = vshufps_avx(local_188,local_188,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar224 = pre->ray_space[k].vz.field_0.m128[0];
  fVar205 = pre->ray_space[k].vz.field_0.m128[1];
  fVar219 = pre->ray_space[k].vz.field_0.m128[2];
  fVar220 = pre->ray_space[k].vz.field_0.m128[3];
  auVar101._0_4_ = fVar224 * auVar41._0_4_;
  auVar101._4_4_ = fVar205 * auVar41._4_4_;
  auVar101._8_4_ = fVar219 * auVar41._8_4_;
  auVar101._12_4_ = fVar220 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar4,auVar40);
  auVar51 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar105);
  local_198 = vsubps_avx512vl(local_218,auVar39);
  uVar98 = local_198._0_4_;
  auVar116._4_4_ = uVar98;
  auVar116._0_4_ = uVar98;
  auVar116._8_4_ = uVar98;
  auVar116._12_4_ = uVar98;
  auVar40 = vshufps_avx(local_198,local_198,0x55);
  auVar41 = vshufps_avx(local_198,local_198,0xaa);
  auVar106._0_4_ = fVar224 * auVar41._0_4_;
  auVar106._4_4_ = fVar205 * auVar41._4_4_;
  auVar106._8_4_ = fVar219 * auVar41._8_4_;
  auVar106._12_4_ = fVar220 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar4,auVar40);
  auVar52 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar116);
  local_1a8 = vsubps_avx512vl(local_228,auVar39);
  uVar98 = local_1a8._0_4_;
  auVar168._4_4_ = uVar98;
  auVar168._0_4_ = uVar98;
  auVar168._8_4_ = uVar98;
  auVar168._12_4_ = uVar98;
  auVar40 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar41 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar117._0_4_ = fVar224 * auVar41._0_4_;
  auVar117._4_4_ = fVar205 * auVar41._4_4_;
  auVar117._8_4_ = fVar219 * auVar41._8_4_;
  auVar117._12_4_ = fVar220 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar4,auVar40);
  auVar55 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar168);
  local_1b8 = vsubps_avx(local_238,auVar39);
  uVar98 = local_1b8._0_4_;
  auVar188._4_4_ = uVar98;
  auVar188._0_4_ = uVar98;
  auVar188._8_4_ = uVar98;
  auVar188._12_4_ = uVar98;
  auVar40 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar41 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar169._0_4_ = fVar224 * auVar41._0_4_;
  auVar169._4_4_ = fVar205 * auVar41._4_4_;
  auVar169._8_4_ = fVar219 * auVar41._8_4_;
  auVar169._12_4_ = fVar220 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar4,auVar40);
  auVar56 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar188);
  local_1c8 = vsubps_avx512vl(_local_248,auVar39);
  uVar98 = local_1c8._0_4_;
  auVar189._4_4_ = uVar98;
  auVar189._0_4_ = uVar98;
  auVar189._8_4_ = uVar98;
  auVar189._12_4_ = uVar98;
  auVar40 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar41 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar208._0_4_ = auVar41._0_4_ * fVar224;
  auVar208._4_4_ = auVar41._4_4_ * fVar205;
  auVar208._8_4_ = auVar41._8_4_ * fVar219;
  auVar208._12_4_ = auVar41._12_4_ * fVar220;
  auVar40 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar4,auVar40);
  auVar57 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar189);
  local_1d8 = vsubps_avx512vl(_local_258,auVar39);
  uVar98 = local_1d8._0_4_;
  auVar190._4_4_ = uVar98;
  auVar190._0_4_ = uVar98;
  auVar190._8_4_ = uVar98;
  auVar190._12_4_ = uVar98;
  auVar40 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar41 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar225._0_4_ = auVar41._0_4_ * fVar224;
  auVar225._4_4_ = auVar41._4_4_ * fVar205;
  auVar225._8_4_ = auVar41._8_4_ * fVar219;
  auVar225._12_4_ = auVar41._12_4_ * fVar220;
  auVar40 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar4,auVar40);
  auVar61 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar190);
  local_1e8 = vsubps_avx512vl(_local_268,auVar39);
  uVar98 = local_1e8._0_4_;
  auVar191._4_4_ = uVar98;
  auVar191._0_4_ = uVar98;
  auVar191._8_4_ = uVar98;
  auVar191._12_4_ = uVar98;
  auVar40 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar41 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar232._0_4_ = auVar41._0_4_ * fVar224;
  auVar232._4_4_ = auVar41._4_4_ * fVar205;
  auVar232._8_4_ = auVar41._8_4_ * fVar219;
  auVar232._12_4_ = auVar41._12_4_ * fVar220;
  auVar40 = vfmadd231ps_fma(auVar232,(undefined1  [16])aVar4,auVar40);
  auVar59 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar191);
  local_1f8 = vsubps_avx(_local_278,auVar39);
  uVar98 = local_1f8._0_4_;
  auVar139._4_4_ = uVar98;
  auVar139._0_4_ = uVar98;
  auVar139._8_4_ = uVar98;
  auVar139._12_4_ = uVar98;
  auVar39 = vshufps_avx(local_1f8,local_1f8,0x55);
  auVar40 = vshufps_avx(local_1f8,local_1f8,0xaa);
  auVar176._0_4_ = auVar40._0_4_ * fVar224;
  auVar176._4_4_ = auVar40._4_4_ * fVar205;
  auVar176._8_4_ = auVar40._8_4_ * fVar219;
  auVar176._12_4_ = auVar40._12_4_ * fVar220;
  auVar39 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar4,auVar39);
  auVar60 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar139);
  auVar50 = vmovlhps_avx512f(auVar51,auVar57);
  auVar41 = vmovlhps_avx(auVar52,auVar61);
  auVar48 = vmovlhps_avx(auVar55,auVar59);
  _local_398 = vmovlhps_avx(auVar56,auVar60);
  auVar40 = vminps_avx512vl(auVar50,auVar41);
  auVar53 = vmaxps_avx512vl(auVar50,auVar41);
  auVar39 = vminps_avx(auVar48,_local_398);
  auVar40 = vminps_avx(auVar40,auVar39);
  auVar39 = vmaxps_avx(auVar48,_local_398);
  auVar39 = vmaxps_avx(auVar53,auVar39);
  auVar53 = vshufpd_avx(auVar40,auVar40,3);
  auVar40 = vminps_avx(auVar40,auVar53);
  auVar53 = vshufpd_avx(auVar39,auVar39,3);
  auVar39 = vmaxps_avx(auVar39,auVar53);
  auVar40 = vandps_avx512vl(auVar40,auVar262._0_16_);
  auVar39 = vandps_avx512vl(auVar39,auVar262._0_16_);
  auVar39 = vmaxps_avx(auVar40,auVar39);
  auVar40 = vmovshdup_avx(auVar39);
  auVar39 = vmaxss_avx(auVar40,auVar39);
  local_318 = vmovddup_avx512vl(auVar51);
  local_328 = vmovddup_avx512vl(auVar52);
  local_338 = vmovddup_avx512vl(auVar55);
  local_348._0_8_ = auVar56._0_8_;
  local_348._8_8_ = local_348._0_8_;
  register0x00001308 = auVar57._0_8_;
  local_358 = auVar57._0_8_;
  register0x00001348 = auVar61._0_8_;
  local_368 = auVar61._0_8_;
  register0x00001488 = auVar59._0_8_;
  local_378 = auVar59._0_8_;
  local_388 = auVar60._0_8_;
  register0x000013c8 = local_388;
  local_3a8 = ZEXT416((uint)(auVar39._0_4_ * 9.536743e-07));
  local_98 = vbroadcastss_avx512vl(local_3a8);
  auVar39 = vxorps_avx512vl(local_98._0_16_,auVar58);
  local_78 = auVar39._0_4_;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  uStack_68 = local_78;
  uStack_64 = local_78;
  uStack_60 = local_78;
  uStack_5c = local_78;
  uVar29 = 0;
  local_158 = vsubps_avx512vl(auVar41,auVar50);
  local_168 = vsubps_avx(auVar48,auVar41);
  local_178 = vsubps_avx(_local_398,auVar48);
  local_288 = vsubps_avx512vl(_local_248,local_208);
  local_298 = vsubps_avx512vl(_local_258,local_218);
  local_2a8 = vsubps_avx512vl(_local_268,local_228);
  _local_2b8 = vsubps_avx(_local_278,local_238);
  local_2d8 = vpbroadcastd_avx512vl();
  local_2e8 = vpbroadcastd_avx512vl();
  auVar39 = ZEXT816(0x3f80000000000000);
  auVar259 = ZEXT1664(auVar39);
  do {
    auVar61 = auVar259._0_16_;
    auVar53 = vshufps_avx512vl(auVar61,auVar61,0x50);
    auVar242._8_4_ = 0x3f800000;
    auVar242._0_8_ = &DAT_3f8000003f800000;
    auVar242._12_4_ = 0x3f800000;
    auVar247._16_4_ = 0x3f800000;
    auVar247._0_16_ = auVar242;
    auVar247._20_4_ = 0x3f800000;
    auVar247._24_4_ = 0x3f800000;
    auVar247._28_4_ = 0x3f800000;
    auVar40 = vsubps_avx(auVar242,auVar53);
    fVar224 = auVar53._0_4_;
    auVar125._0_4_ = local_358._0_4_ * fVar224;
    fVar205 = auVar53._4_4_;
    auVar125._4_4_ = local_358._4_4_ * fVar205;
    fVar219 = auVar53._8_4_;
    auVar125._8_4_ = local_358._8_4_ * fVar219;
    fVar220 = auVar53._12_4_;
    auVar125._12_4_ = local_358._12_4_ * fVar220;
    auVar140._0_4_ = local_368._0_4_ * fVar224;
    auVar140._4_4_ = local_368._4_4_ * fVar205;
    auVar140._8_4_ = local_368._8_4_ * fVar219;
    auVar140._12_4_ = local_368._12_4_ * fVar220;
    auVar154._0_4_ = local_378._0_4_ * fVar224;
    auVar154._4_4_ = local_378._4_4_ * fVar205;
    auVar154._8_4_ = local_378._8_4_ * fVar219;
    auVar154._12_4_ = local_378._12_4_ * fVar220;
    auVar107._0_4_ = local_388._0_4_ * fVar224;
    auVar107._4_4_ = local_388._4_4_ * fVar205;
    auVar107._8_4_ = local_388._8_4_ * fVar219;
    auVar107._12_4_ = local_388._12_4_ * fVar220;
    auVar51 = vfmadd231ps_avx512vl(auVar125,auVar40,local_318);
    auVar52 = vfmadd231ps_avx512vl(auVar140,auVar40,local_328);
    auVar55 = vfmadd231ps_avx512vl(auVar154,auVar40,local_338);
    auVar53 = vfmadd231ps_fma(auVar107,local_348,auVar40);
    auVar40 = vmovshdup_avx(auVar39);
    fVar205 = auVar39._0_4_;
    fVar224 = (auVar40._0_4_ - fVar205) * 0.04761905;
    auVar130._4_4_ = fVar205;
    auVar130._0_4_ = fVar205;
    auVar130._8_4_ = fVar205;
    auVar130._12_4_ = fVar205;
    auVar130._16_4_ = fVar205;
    auVar130._20_4_ = fVar205;
    auVar130._24_4_ = fVar205;
    auVar130._28_4_ = fVar205;
    auVar73._0_8_ = auVar40._0_8_;
    auVar73._8_8_ = auVar73._0_8_;
    auVar73._16_8_ = auVar73._0_8_;
    auVar73._24_8_ = auVar73._0_8_;
    auVar80 = vsubps_avx(auVar73,auVar130);
    uVar98 = auVar51._0_4_;
    auVar82._4_4_ = uVar98;
    auVar82._0_4_ = uVar98;
    auVar82._8_4_ = uVar98;
    auVar82._12_4_ = uVar98;
    auVar82._16_4_ = uVar98;
    auVar82._20_4_ = uVar98;
    auVar82._24_4_ = uVar98;
    auVar82._28_4_ = uVar98;
    auVar202._8_4_ = 1;
    auVar202._0_8_ = 0x100000001;
    auVar202._12_4_ = 1;
    auVar202._16_4_ = 1;
    auVar202._20_4_ = 1;
    auVar202._24_4_ = 1;
    auVar202._28_4_ = 1;
    auVar78 = ZEXT1632(auVar51);
    auVar76 = vpermps_avx2(auVar202,auVar78);
    auVar62 = vbroadcastss_avx512vl(auVar52);
    auVar79 = ZEXT1632(auVar52);
    auVar63 = vpermps_avx512vl(auVar202,auVar79);
    auVar64 = vbroadcastss_avx512vl(auVar55);
    auVar77 = ZEXT1632(auVar55);
    auVar65 = vpermps_avx512vl(auVar202,auVar77);
    auVar66 = vbroadcastss_avx512vl(auVar53);
    auVar75 = ZEXT1632(auVar53);
    auVar67 = vpermps_avx512vl(auVar202,auVar75);
    auVar203._4_4_ = fVar224;
    auVar203._0_4_ = fVar224;
    auVar203._8_4_ = fVar224;
    auVar203._12_4_ = fVar224;
    auVar203._16_4_ = fVar224;
    auVar203._20_4_ = fVar224;
    auVar203._24_4_ = fVar224;
    auVar203._28_4_ = fVar224;
    auVar74._8_4_ = 2;
    auVar74._0_8_ = 0x200000002;
    auVar74._12_4_ = 2;
    auVar74._16_4_ = 2;
    auVar74._20_4_ = 2;
    auVar74._24_4_ = 2;
    auVar74._28_4_ = 2;
    auVar68 = vpermps_avx512vl(auVar74,auVar78);
    auVar69 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar70 = vpermps_avx512vl(auVar69,auVar78);
    auVar78 = vpermps_avx2(auVar74,auVar79);
    auVar71 = vpermps_avx512vl(auVar69,auVar79);
    auVar79 = vpermps_avx2(auVar74,auVar77);
    auVar72 = vpermps_avx512vl(auVar69,auVar77);
    auVar73 = vpermps_avx512vl(auVar74,auVar75);
    auVar74 = vpermps_avx512vl(auVar69,auVar75);
    auVar40 = vfmadd132ps_fma(auVar80,auVar130,_DAT_02020f20);
    auVar80 = vsubps_avx(auVar247,ZEXT1632(auVar40));
    auVar69 = vmulps_avx512vl(auVar62,ZEXT1632(auVar40));
    auVar77 = ZEXT1632(auVar40);
    auVar75 = vmulps_avx512vl(auVar63,auVar77);
    auVar53 = vfmadd231ps_fma(auVar69,auVar80,auVar82);
    auVar51 = vfmadd231ps_fma(auVar75,auVar80,auVar76);
    auVar69 = vmulps_avx512vl(auVar64,auVar77);
    auVar75 = vmulps_avx512vl(auVar65,auVar77);
    auVar62 = vfmadd231ps_avx512vl(auVar69,auVar80,auVar62);
    auVar63 = vfmadd231ps_avx512vl(auVar75,auVar80,auVar63);
    auVar69 = vmulps_avx512vl(auVar66,auVar77);
    auVar82 = ZEXT1632(auVar40);
    auVar67 = vmulps_avx512vl(auVar67,auVar82);
    auVar64 = vfmadd231ps_avx512vl(auVar69,auVar80,auVar64);
    auVar65 = vfmadd231ps_avx512vl(auVar67,auVar80,auVar65);
    fVar219 = auVar40._0_4_;
    fVar220 = auVar40._4_4_;
    auVar67._4_4_ = fVar220 * auVar62._4_4_;
    auVar67._0_4_ = fVar219 * auVar62._0_4_;
    fVar221 = auVar40._8_4_;
    auVar67._8_4_ = fVar221 * auVar62._8_4_;
    fVar222 = auVar40._12_4_;
    auVar67._12_4_ = fVar222 * auVar62._12_4_;
    auVar67._16_4_ = auVar62._16_4_ * 0.0;
    auVar67._20_4_ = auVar62._20_4_ * 0.0;
    auVar67._24_4_ = auVar62._24_4_ * 0.0;
    auVar67._28_4_ = fVar205;
    auVar69._4_4_ = fVar220 * auVar63._4_4_;
    auVar69._0_4_ = fVar219 * auVar63._0_4_;
    auVar69._8_4_ = fVar221 * auVar63._8_4_;
    auVar69._12_4_ = fVar222 * auVar63._12_4_;
    auVar69._16_4_ = auVar63._16_4_ * 0.0;
    auVar69._20_4_ = auVar63._20_4_ * 0.0;
    auVar69._24_4_ = auVar63._24_4_ * 0.0;
    auVar69._28_4_ = auVar76._28_4_;
    auVar53 = vfmadd231ps_fma(auVar67,auVar80,ZEXT1632(auVar53));
    auVar51 = vfmadd231ps_fma(auVar69,auVar80,ZEXT1632(auVar51));
    auVar81._0_4_ = fVar219 * auVar64._0_4_;
    auVar81._4_4_ = fVar220 * auVar64._4_4_;
    auVar81._8_4_ = fVar221 * auVar64._8_4_;
    auVar81._12_4_ = fVar222 * auVar64._12_4_;
    auVar81._16_4_ = auVar64._16_4_ * 0.0;
    auVar81._20_4_ = auVar64._20_4_ * 0.0;
    auVar81._24_4_ = auVar64._24_4_ * 0.0;
    auVar81._28_4_ = 0;
    auVar75._4_4_ = fVar220 * auVar65._4_4_;
    auVar75._0_4_ = fVar219 * auVar65._0_4_;
    auVar75._8_4_ = fVar221 * auVar65._8_4_;
    auVar75._12_4_ = fVar222 * auVar65._12_4_;
    auVar75._16_4_ = auVar65._16_4_ * 0.0;
    auVar75._20_4_ = auVar65._20_4_ * 0.0;
    auVar75._24_4_ = auVar65._24_4_ * 0.0;
    auVar75._28_4_ = auVar64._28_4_;
    auVar52 = vfmadd231ps_fma(auVar81,auVar80,auVar62);
    auVar55 = vfmadd231ps_fma(auVar75,auVar80,auVar63);
    auVar77._28_4_ = auVar63._28_4_;
    auVar77._0_28_ =
         ZEXT1628(CONCAT412(fVar222 * auVar55._12_4_,
                            CONCAT48(fVar221 * auVar55._8_4_,
                                     CONCAT44(fVar220 * auVar55._4_4_,fVar219 * auVar55._0_4_))));
    auVar56 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar222 * auVar52._12_4_,
                                                 CONCAT48(fVar221 * auVar52._8_4_,
                                                          CONCAT44(fVar220 * auVar52._4_4_,
                                                                   fVar219 * auVar52._0_4_)))),
                              auVar80,ZEXT1632(auVar53));
    auVar57 = vfmadd231ps_fma(auVar77,auVar80,ZEXT1632(auVar51));
    auVar76 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar53));
    auVar62 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar51));
    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar76 = vmulps_avx512vl(auVar76,auVar63);
    auVar62 = vmulps_avx512vl(auVar62,auVar63);
    auVar145._0_4_ = fVar224 * auVar76._0_4_;
    auVar145._4_4_ = fVar224 * auVar76._4_4_;
    auVar145._8_4_ = fVar224 * auVar76._8_4_;
    auVar145._12_4_ = fVar224 * auVar76._12_4_;
    auVar145._16_4_ = fVar224 * auVar76._16_4_;
    auVar145._20_4_ = fVar224 * auVar76._20_4_;
    auVar145._24_4_ = fVar224 * auVar76._24_4_;
    auVar145._28_4_ = 0;
    auVar76 = vmulps_avx512vl(auVar203,auVar62);
    auVar52 = vxorps_avx512vl(auVar66._0_16_,auVar66._0_16_);
    auVar62 = vpermt2ps_avx512vl(ZEXT1632(auVar56),_DAT_0205fd20,ZEXT1632(auVar52));
    auVar64 = vpermt2ps_avx512vl(ZEXT1632(auVar57),_DAT_0205fd20,ZEXT1632(auVar52));
    auVar113._0_4_ = auVar145._0_4_ + auVar56._0_4_;
    auVar113._4_4_ = auVar145._4_4_ + auVar56._4_4_;
    auVar113._8_4_ = auVar145._8_4_ + auVar56._8_4_;
    auVar113._12_4_ = auVar145._12_4_ + auVar56._12_4_;
    auVar113._16_4_ = auVar145._16_4_ + 0.0;
    auVar113._20_4_ = auVar145._20_4_ + 0.0;
    auVar113._24_4_ = auVar145._24_4_ + 0.0;
    auVar113._28_4_ = 0;
    auVar81 = ZEXT1632(auVar52);
    auVar65 = vpermt2ps_avx512vl(auVar145,_DAT_0205fd20,auVar81);
    auVar66 = vaddps_avx512vl(ZEXT1632(auVar57),auVar76);
    auVar67 = vpermt2ps_avx512vl(auVar76,_DAT_0205fd20,auVar81);
    auVar76 = vsubps_avx(auVar62,auVar65);
    auVar65 = vsubps_avx512vl(auVar64,auVar67);
    auVar67 = vmulps_avx512vl(auVar78,auVar82);
    auVar69 = vmulps_avx512vl(auVar71,auVar82);
    auVar67 = vfmadd231ps_avx512vl(auVar67,auVar80,auVar68);
    auVar69 = vfmadd231ps_avx512vl(auVar69,auVar80,auVar70);
    auVar75 = vmulps_avx512vl(auVar79,auVar82);
    auVar77 = vmulps_avx512vl(auVar72,auVar82);
    auVar78 = vfmadd231ps_avx512vl(auVar75,auVar80,auVar78);
    auVar75 = vfmadd231ps_avx512vl(auVar77,auVar80,auVar71);
    auVar77 = vmulps_avx512vl(auVar73,auVar82);
    auVar68 = vmulps_avx512vl(auVar74,auVar82);
    auVar53 = vfmadd231ps_fma(auVar77,auVar80,auVar79);
    auVar51 = vfmadd231ps_fma(auVar68,auVar80,auVar72);
    auVar77 = vmulps_avx512vl(auVar82,auVar78);
    auVar68 = vmulps_avx512vl(ZEXT1632(auVar40),auVar75);
    auVar67 = vfmadd231ps_avx512vl(auVar77,auVar80,auVar67);
    auVar69 = vfmadd231ps_avx512vl(auVar68,auVar80,auVar69);
    auVar78 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar222 * auVar53._12_4_,
                                            CONCAT48(fVar221 * auVar53._8_4_,
                                                     CONCAT44(fVar220 * auVar53._4_4_,
                                                              fVar219 * auVar53._0_4_)))),auVar80,
                         auVar78);
    auVar75 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar222 * auVar51._12_4_,
                                            CONCAT48(fVar221 * auVar51._8_4_,
                                                     CONCAT44(fVar220 * auVar51._4_4_,
                                                              fVar219 * auVar51._0_4_)))),auVar80,
                         auVar75);
    auVar68._4_4_ = fVar220 * auVar78._4_4_;
    auVar68._0_4_ = fVar219 * auVar78._0_4_;
    auVar68._8_4_ = fVar221 * auVar78._8_4_;
    auVar68._12_4_ = fVar222 * auVar78._12_4_;
    auVar68._16_4_ = auVar78._16_4_ * 0.0;
    auVar68._20_4_ = auVar78._20_4_ * 0.0;
    auVar68._24_4_ = auVar78._24_4_ * 0.0;
    auVar68._28_4_ = auVar72._28_4_;
    auVar70._4_4_ = fVar220 * auVar75._4_4_;
    auVar70._0_4_ = fVar219 * auVar75._0_4_;
    auVar70._8_4_ = fVar221 * auVar75._8_4_;
    auVar70._12_4_ = fVar222 * auVar75._12_4_;
    auVar70._16_4_ = auVar75._16_4_ * 0.0;
    auVar70._20_4_ = auVar75._20_4_ * 0.0;
    auVar70._24_4_ = auVar75._24_4_ * 0.0;
    auVar70._28_4_ = auVar79._28_4_;
    auVar79 = vfmadd231ps_avx512vl(auVar68,auVar80,auVar67);
    auVar77 = vfmadd231ps_avx512vl(auVar70,auVar69,auVar80);
    auVar80 = vsubps_avx512vl(auVar78,auVar67);
    auVar78 = vsubps_avx512vl(auVar75,auVar69);
    auVar80 = vmulps_avx512vl(auVar80,auVar63);
    auVar78 = vmulps_avx512vl(auVar78,auVar63);
    fVar205 = fVar224 * auVar80._0_4_;
    fVar219 = fVar224 * auVar80._4_4_;
    auVar71._4_4_ = fVar219;
    auVar71._0_4_ = fVar205;
    fVar220 = fVar224 * auVar80._8_4_;
    auVar71._8_4_ = fVar220;
    fVar221 = fVar224 * auVar80._12_4_;
    auVar71._12_4_ = fVar221;
    fVar222 = fVar224 * auVar80._16_4_;
    auVar71._16_4_ = fVar222;
    fVar223 = fVar224 * auVar80._20_4_;
    auVar71._20_4_ = fVar223;
    fVar224 = fVar224 * auVar80._24_4_;
    auVar71._24_4_ = fVar224;
    auVar71._28_4_ = auVar80._28_4_;
    auVar78 = vmulps_avx512vl(auVar203,auVar78);
    auVar63 = vpermt2ps_avx512vl(auVar79,_DAT_0205fd20,auVar81);
    auVar67 = vpermt2ps_avx512vl(auVar77,_DAT_0205fd20,auVar81);
    auVar204._0_4_ = auVar79._0_4_ + fVar205;
    auVar204._4_4_ = auVar79._4_4_ + fVar219;
    auVar204._8_4_ = auVar79._8_4_ + fVar220;
    auVar204._12_4_ = auVar79._12_4_ + fVar221;
    auVar204._16_4_ = auVar79._16_4_ + fVar222;
    auVar204._20_4_ = auVar79._20_4_ + fVar223;
    auVar204._24_4_ = auVar79._24_4_ + fVar224;
    auVar204._28_4_ = auVar79._28_4_ + auVar80._28_4_;
    auVar80 = vpermt2ps_avx512vl(auVar71,_DAT_0205fd20,ZEXT1632(auVar52));
    auVar69 = vaddps_avx512vl(auVar77,auVar78);
    auVar78 = vpermt2ps_avx512vl(auVar78,_DAT_0205fd20,ZEXT1632(auVar52));
    auVar80 = vsubps_avx(auVar63,auVar80);
    auVar78 = vsubps_avx512vl(auVar67,auVar78);
    auVar130 = ZEXT1632(auVar56);
    auVar75 = vsubps_avx512vl(auVar79,auVar130);
    auVar145 = ZEXT1632(auVar57);
    auVar68 = vsubps_avx512vl(auVar77,auVar145);
    auVar70 = vsubps_avx512vl(auVar63,auVar62);
    auVar75 = vaddps_avx512vl(auVar75,auVar70);
    auVar70 = vsubps_avx512vl(auVar67,auVar64);
    auVar68 = vaddps_avx512vl(auVar68,auVar70);
    auVar70 = vmulps_avx512vl(auVar145,auVar75);
    auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar130,auVar68);
    auVar71 = vmulps_avx512vl(auVar66,auVar75);
    auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar113,auVar68);
    auVar72 = vmulps_avx512vl(auVar65,auVar75);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar76,auVar68);
    auVar73 = vmulps_avx512vl(auVar64,auVar75);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar62,auVar68);
    auVar74 = vmulps_avx512vl(auVar77,auVar75);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar79,auVar68);
    auVar81 = vmulps_avx512vl(auVar69,auVar75);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar204,auVar68);
    auVar82 = vmulps_avx512vl(auVar78,auVar75);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar80,auVar68);
    auVar75 = vmulps_avx512vl(auVar67,auVar75);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar63,auVar68);
    auVar68 = vminps_avx512vl(auVar70,auVar71);
    auVar70 = vmaxps_avx512vl(auVar70,auVar71);
    auVar71 = vminps_avx512vl(auVar72,auVar73);
    auVar68 = vminps_avx512vl(auVar68,auVar71);
    auVar71 = vmaxps_avx512vl(auVar72,auVar73);
    auVar70 = vmaxps_avx512vl(auVar70,auVar71);
    auVar71 = vminps_avx512vl(auVar74,auVar81);
    auVar72 = vmaxps_avx512vl(auVar74,auVar81);
    auVar73 = vminps_avx512vl(auVar82,auVar75);
    auVar71 = vminps_avx512vl(auVar71,auVar73);
    auVar68 = vminps_avx512vl(auVar68,auVar71);
    auVar75 = vmaxps_avx512vl(auVar82,auVar75);
    auVar75 = vmaxps_avx512vl(auVar72,auVar75);
    auVar75 = vmaxps_avx512vl(auVar70,auVar75);
    uVar17 = vcmpps_avx512vl(auVar68,local_98,2);
    auVar72._4_4_ = uStack_74;
    auVar72._0_4_ = local_78;
    auVar72._8_4_ = uStack_70;
    auVar72._12_4_ = uStack_6c;
    auVar72._16_4_ = uStack_68;
    auVar72._20_4_ = uStack_64;
    auVar72._24_4_ = uStack_60;
    auVar72._28_4_ = uStack_5c;
    uVar18 = vcmpps_avx512vl(auVar75,auVar72,5);
    uVar36 = 0;
    bVar26 = (byte)uVar17 & (byte)uVar18 & 0x7f;
    if (bVar26 != 0) {
      auVar75 = vsubps_avx512vl(auVar62,auVar130);
      auVar68 = vsubps_avx512vl(auVar64,auVar145);
      auVar70 = vsubps_avx512vl(auVar63,auVar79);
      auVar75 = vaddps_avx512vl(auVar75,auVar70);
      auVar70 = vsubps_avx512vl(auVar67,auVar77);
      auVar68 = vaddps_avx512vl(auVar68,auVar70);
      auVar70 = vmulps_avx512vl(auVar145,auVar75);
      auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar68,auVar130);
      auVar66 = vmulps_avx512vl(auVar66,auVar75);
      auVar66 = vfnmadd213ps_avx512vl(auVar113,auVar68,auVar66);
      auVar65 = vmulps_avx512vl(auVar65,auVar75);
      auVar65 = vfnmadd213ps_avx512vl(auVar76,auVar68,auVar65);
      auVar76 = vmulps_avx512vl(auVar64,auVar75);
      auVar64 = vfnmadd231ps_avx512vl(auVar76,auVar68,auVar62);
      auVar76 = vmulps_avx512vl(auVar77,auVar75);
      auVar79 = vfnmadd231ps_avx512vl(auVar76,auVar68,auVar79);
      auVar76 = vmulps_avx512vl(auVar69,auVar75);
      auVar69 = vfnmadd213ps_avx512vl(auVar204,auVar68,auVar76);
      auVar76 = vmulps_avx512vl(auVar78,auVar75);
      auVar77 = vfnmadd213ps_avx512vl(auVar80,auVar68,auVar76);
      auVar80 = vmulps_avx512vl(auVar67,auVar75);
      auVar63 = vfnmadd231ps_avx512vl(auVar80,auVar63,auVar68);
      auVar76 = vminps_avx(auVar70,auVar66);
      auVar80 = vmaxps_avx(auVar70,auVar66);
      auVar62 = vminps_avx(auVar65,auVar64);
      auVar62 = vminps_avx(auVar76,auVar62);
      auVar76 = vmaxps_avx(auVar65,auVar64);
      auVar80 = vmaxps_avx(auVar80,auVar76);
      auVar78 = vminps_avx(auVar79,auVar69);
      auVar76 = vmaxps_avx(auVar79,auVar69);
      auVar79 = vminps_avx(auVar77,auVar63);
      auVar78 = vminps_avx(auVar78,auVar79);
      auVar78 = vminps_avx(auVar62,auVar78);
      auVar62 = vmaxps_avx(auVar77,auVar63);
      auVar76 = vmaxps_avx(auVar76,auVar62);
      auVar80 = vmaxps_avx(auVar80,auVar76);
      uVar17 = vcmpps_avx512vl(auVar80,auVar72,5);
      uVar18 = vcmpps_avx512vl(auVar78,local_98,2);
      uVar36 = (uint)(bVar26 & (byte)uVar17 & (byte)uVar18);
    }
    if (uVar36 != 0) {
      auStack_308[uVar29] = uVar36;
      uVar17 = vmovlps_avx(auVar39);
      *(undefined8 *)(&uStack_148 + uVar29 * 2) = uVar17;
      uVar38 = vmovlps_avx(auVar61);
      auStack_58[uVar29] = uVar38;
      uVar29 = (ulong)((int)uVar29 + 1);
    }
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar261 = ZEXT1664(auVar39);
    auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar260 = ZEXT3264(auVar80);
    in_ZMM19 = ZEXT464(0x3e2aaaab);
    in_ZMM22 = ZEXT464(0x38d1b717);
    do {
      auVar53 = auVar266._0_16_;
      auVar39 = SUB6416(ZEXT464(0xb8d1b717),0);
      auVar40 = SUB6416(ZEXT464(0x38d1b717),0);
      if ((int)uVar29 == 0) {
        uVar98 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar22._4_4_ = uVar98;
        auVar22._0_4_ = uVar98;
        auVar22._8_4_ = uVar98;
        auVar22._12_4_ = uVar98;
        uVar17 = vcmpps_avx512vl(local_2c8,auVar22,2);
        uVar33 = (uint)uVar37 & (uint)uVar37 + 0xf & (uint)uVar17;
        uVar37 = (ulong)uVar33;
        if (uVar33 == 0) {
          return;
        }
        goto LAB_01c1fcfc;
      }
      uVar27 = (int)uVar29 - 1;
      uVar30 = (ulong)uVar27;
      uVar36 = (&uStack_148)[uVar30 * 2];
      fVar224 = afStack_144[uVar30 * 2];
      uVar6 = auStack_308[uVar30];
      uVar38 = auStack_58[uVar30];
      auVar259 = ZEXT864(uVar38);
      lVar32 = 0;
      for (uVar35 = (ulong)uVar6; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
        lVar32 = lVar32 + 1;
      }
      uVar34 = uVar6 - 1 & uVar6;
      auStack_308[uVar30] = uVar34;
      if (uVar34 == 0) {
        uVar29 = (ulong)uVar27;
      }
      auVar118._0_4_ = (float)lVar32;
      auVar118._4_8_ = SUB128(ZEXT812(0),4);
      auVar118._12_4_ = 0;
      auVar51 = vmulss_avx512f(auVar118,SUB6416(ZEXT464(0x3e124925),0));
      lVar32 = lVar32 + 1;
      auVar52 = vmulss_avx512f(ZEXT416((uint)(float)lVar32),SUB6416(ZEXT464(0x3e124925),0));
      auVar56 = auVar264._0_16_;
      auVar55 = vsubss_avx512f(auVar56,auVar51);
      auVar51 = vmulss_avx512f(ZEXT416((uint)fVar224),auVar51);
      auVar95._0_16_ = vfmadd231ss_avx512f(auVar51,ZEXT416(uVar36),auVar55);
      auVar51 = vsubss_avx512f(auVar56,auVar52);
      auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar224 * auVar52._0_4_)),ZEXT416(uVar36),auVar51);
      auVar55 = vsubss_avx512f(auVar52,auVar95._0_16_);
      auVar51 = vucomiss_avx512f(auVar55);
      in_ZMM19 = ZEXT1664(auVar51);
      if (uVar6 == 0 || lVar32 == 0) break;
      auVar257._8_8_ = 0;
      auVar257._0_8_ = uVar38;
      auVar51 = vshufps_avx512vl(auVar257,auVar257,0x50);
      vucomiss_avx512f(auVar55);
      uVar36 = (uint)uVar29;
      auVar103 = auVar263._0_16_;
      auVar59 = vsubps_avx512vl(auVar103,auVar51);
      fVar224 = auVar51._0_4_;
      auVar126._0_4_ = fVar224 * (float)local_358._0_4_;
      fVar205 = auVar51._4_4_;
      auVar126._4_4_ = fVar205 * (float)local_358._4_4_;
      fVar219 = auVar51._8_4_;
      auVar126._8_4_ = fVar219 * fStack_350;
      fVar220 = auVar51._12_4_;
      auVar126._12_4_ = fVar220 * fStack_34c;
      auVar141._0_4_ = fVar224 * (float)local_368._0_4_;
      auVar141._4_4_ = fVar205 * (float)local_368._4_4_;
      auVar141._8_4_ = fVar219 * fStack_360;
      auVar141._12_4_ = fVar220 * fStack_35c;
      auVar155._0_4_ = fVar224 * (float)local_378._0_4_;
      auVar155._4_4_ = fVar205 * (float)local_378._4_4_;
      auVar155._8_4_ = fVar219 * fStack_370;
      auVar155._12_4_ = fVar220 * fStack_36c;
      auVar108._0_4_ = fVar224 * (float)local_388._0_4_;
      auVar108._4_4_ = fVar205 * (float)local_388._4_4_;
      auVar108._8_4_ = fVar219 * fStack_380;
      auVar108._12_4_ = fVar220 * fStack_37c;
      auVar51 = vfmadd231ps_fma(auVar126,auVar59,local_318);
      auVar57 = vfmadd231ps_fma(auVar141,auVar59,local_328);
      auVar61 = vfmadd231ps_fma(auVar155,auVar59,local_338);
      auVar59 = vfmadd231ps_fma(auVar108,auVar59,local_348);
      auVar121._16_16_ = auVar51;
      auVar121._0_16_ = auVar51;
      auVar131._16_16_ = auVar57;
      auVar131._0_16_ = auVar57;
      auVar146._16_16_ = auVar61;
      auVar146._0_16_ = auVar61;
      auVar51 = vbroadcastss_avx512vl(auVar95._0_16_);
      uVar98 = auVar52._0_4_;
      auVar173._20_4_ = uVar98;
      auVar173._16_4_ = uVar98;
      auVar173._24_4_ = uVar98;
      auVar173._28_4_ = uVar98;
      auVar173._0_16_ = auVar51;
      auVar80 = vsubps_avx(auVar131,auVar121);
      auVar57 = vfmadd213ps_fma(auVar80,auVar173,auVar121);
      auVar80 = vsubps_avx(auVar146,auVar131);
      auVar60 = vfmadd213ps_fma(auVar80,auVar173,auVar131);
      auVar51 = vsubps_avx(auVar59,auVar61);
      auVar132._16_16_ = auVar51;
      auVar132._0_16_ = auVar51;
      auVar51 = vfmadd213ps_fma(auVar132,auVar173,auVar146);
      auVar80 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar57));
      auVar57 = vfmadd213ps_fma(auVar80,auVar173,ZEXT1632(auVar57));
      auVar80 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar60));
      auVar51 = vfmadd213ps_fma(auVar80,auVar173,ZEXT1632(auVar60));
      auVar80 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar57));
      auVar54 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar80,auVar173);
      auVar76 = vmulps_avx512vl(auVar80,auVar260._0_32_);
      auVar80._16_16_ = auVar76._16_16_;
      auVar80._0_16_ = vmulss_avx512f(auVar55,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar224 = auVar80._0_4_;
      auVar156._0_8_ =
           CONCAT44(auVar54._4_4_ + fVar224 * auVar76._4_4_,auVar54._0_4_ + fVar224 * auVar76._0_4_)
      ;
      auVar156._8_4_ = auVar54._8_4_ + fVar224 * auVar76._8_4_;
      auVar156._12_4_ = auVar54._12_4_ + fVar224 * auVar76._12_4_;
      auVar127._0_4_ = fVar224 * auVar76._16_4_;
      auVar127._4_4_ = fVar224 * auVar76._20_4_;
      auVar127._8_4_ = fVar224 * auVar76._24_4_;
      auVar127._12_4_ = fVar224 * auVar76._28_4_;
      auVar47 = vsubps_avx((undefined1  [16])0x0,auVar127);
      auVar42 = vshufpd_avx(auVar54,auVar54,3);
      auVar43 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar51 = vsubps_avx(auVar42,auVar54);
      auVar57 = vsubps_avx(auVar43,(undefined1  [16])0x0);
      auVar177._0_4_ = auVar57._0_4_ + auVar51._0_4_;
      auVar177._4_4_ = auVar57._4_4_ + auVar51._4_4_;
      auVar177._8_4_ = auVar57._8_4_ + auVar51._8_4_;
      auVar177._12_4_ = auVar57._12_4_ + auVar51._12_4_;
      auVar51 = vshufps_avx(auVar54,auVar54,0xb1);
      auVar57 = vshufps_avx(auVar156,auVar156,0xb1);
      auVar61 = vshufps_avx(auVar47,auVar47,0xb1);
      auVar59 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar233._4_4_ = auVar177._0_4_;
      auVar233._0_4_ = auVar177._0_4_;
      auVar233._8_4_ = auVar177._0_4_;
      auVar233._12_4_ = auVar177._0_4_;
      auVar60 = vshufps_avx(auVar177,auVar177,0x55);
      fVar224 = auVar60._0_4_;
      auVar192._0_4_ = auVar51._0_4_ * fVar224;
      fVar205 = auVar60._4_4_;
      auVar192._4_4_ = auVar51._4_4_ * fVar205;
      fVar219 = auVar60._8_4_;
      auVar192._8_4_ = auVar51._8_4_ * fVar219;
      fVar220 = auVar60._12_4_;
      auVar192._12_4_ = auVar51._12_4_ * fVar220;
      auVar199._0_4_ = auVar57._0_4_ * fVar224;
      auVar199._4_4_ = auVar57._4_4_ * fVar205;
      auVar199._8_4_ = auVar57._8_4_ * fVar219;
      auVar199._12_4_ = auVar57._12_4_ * fVar220;
      auVar209._0_4_ = auVar61._0_4_ * fVar224;
      auVar209._4_4_ = auVar61._4_4_ * fVar205;
      auVar209._8_4_ = auVar61._8_4_ * fVar219;
      auVar209._12_4_ = auVar61._12_4_ * fVar220;
      auVar178._0_4_ = auVar59._0_4_ * fVar224;
      auVar178._4_4_ = auVar59._4_4_ * fVar205;
      auVar178._8_4_ = auVar59._8_4_ * fVar219;
      auVar178._12_4_ = auVar59._12_4_ * fVar220;
      auVar51 = vfmadd231ps_fma(auVar192,auVar233,auVar54);
      auVar57 = vfmadd231ps_fma(auVar199,auVar233,auVar156);
      auVar60 = vfmadd231ps_fma(auVar209,auVar233,auVar47);
      auVar49 = vfmadd231ps_fma(auVar178,(undefined1  [16])0x0,auVar233);
      auVar58 = vshufpd_avx(auVar51,auVar51,1);
      auVar44 = vshufpd_avx(auVar57,auVar57,1);
      auVar45 = vshufpd_avx(auVar60,auVar60,1);
      auVar46 = vshufpd_avx(auVar49,auVar49,1);
      auVar61 = vminss_avx(auVar51,auVar57);
      auVar51 = vmaxss_avx(auVar57,auVar51);
      auVar59 = vminss_avx(auVar60,auVar49);
      auVar57 = vmaxss_avx(auVar49,auVar60);
      auVar59 = vminss_avx(auVar61,auVar59);
      auVar51 = vmaxss_avx(auVar57,auVar51);
      auVar60 = vminss_avx(auVar58,auVar44);
      auVar57 = vmaxss_avx(auVar44,auVar58);
      auVar58 = vminss_avx(auVar45,auVar46);
      auVar61 = vmaxss_avx(auVar46,auVar45);
      auVar60 = vminss_avx(auVar60,auVar58);
      auVar57 = vmaxss_avx(auVar61,auVar57);
      auVar61 = vucomiss_avx512f(auVar59);
      in_ZMM22 = ZEXT1664(auVar61);
      if ((uVar36 < 5) || (auVar57 = vucomiss_avx512f(auVar39), uVar36 < 5)) {
        auVar51 = vucomiss_avx512f(auVar39);
        uVar17 = vcmpps_avx512vl(auVar60,auVar40,1);
        uVar18 = vcmpps_avx512vl(auVar59,auVar40,1);
        if ((4 < uVar36 & ((byte)uVar18 | (byte)uVar17)) != 0) goto LAB_01c20fb8;
        uVar17 = vcmpps_avx512vl(auVar39,auVar57,5);
        uVar18 = vcmpps_avx512vl(auVar60,auVar40,5);
        if ((((ushort)uVar18 | (ushort)uVar17) & 1) == 0) goto LAB_01c20fb8;
        bVar13 = true;
      }
      else {
LAB_01c20fb8:
        auVar258._8_8_ = 0;
        auVar258._0_8_ = uVar38;
        uVar17 = vcmpss_avx512f(auVar59,auVar53,1);
        bVar13 = (bool)((byte)uVar17 & 1);
        iVar96 = auVar264._0_4_;
        fVar224 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar96);
        uVar17 = vcmpss_avx512f(auVar51,auVar53,1);
        bVar13 = (bool)((byte)uVar17 & 1);
        fVar205 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar96);
        bVar13 = fVar224 != fVar205;
        iVar265 = auVar266._0_4_;
        auVar84._16_16_ = auVar80._16_16_;
        auVar84._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar83._4_28_ = auVar84._4_28_;
        auVar83._0_4_ = (uint)bVar13 * iVar265 + (uint)!bVar13 * 0x7f800000;
        auVar40 = auVar83._0_16_;
        auVar86._16_16_ = auVar80._16_16_;
        auVar86._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar85._4_28_ = auVar86._4_28_;
        auVar85._0_4_ = (uint)bVar13 * iVar265 + (uint)!bVar13 * -0x800000;
        auVar39 = auVar85._0_16_;
        uVar17 = vcmpss_avx512f(auVar60,auVar53,1);
        bVar13 = (bool)((byte)uVar17 & 1);
        fVar219 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar96);
        if ((fVar224 != fVar219) || (NAN(fVar224) || NAN(fVar219))) {
          fVar220 = auVar60._0_4_;
          fVar224 = auVar59._0_4_;
          bVar13 = fVar220 == fVar224;
          if ((!bVar13) || (NAN(fVar220) || NAN(fVar224))) {
            auVar21._8_4_ = 0x80000000;
            auVar21._0_8_ = 0x8000000080000000;
            auVar21._12_4_ = 0x80000000;
            auVar61 = vxorps_avx512vl(auVar59,auVar21);
            auVar250._0_4_ = auVar61._0_4_ / (fVar220 - fVar224);
            auVar250._4_12_ = auVar61._4_12_;
            auVar61 = vsubss_avx512f(auVar56,auVar250);
            auVar59 = vfmadd213ss_avx512f(auVar61,auVar53,auVar250);
            auVar61 = auVar59;
          }
          else {
            vucomiss_avx512f(auVar53);
            auVar88._16_16_ = auVar80._16_16_;
            auVar88._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar87._4_28_ = auVar88._4_28_;
            auVar87._0_4_ = (uint)bVar13 * iVar265 + (uint)!bVar13 * 0x7f800000;
            auVar59 = auVar87._0_16_;
            auVar61 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar40 = vminss_avx(auVar40,auVar59);
          auVar39 = vmaxss_avx(auVar61,auVar39);
        }
        uVar17 = vcmpss_avx512f(auVar57,auVar53,1);
        bVar13 = (bool)((byte)uVar17 & 1);
        fVar224 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar96);
        if ((fVar205 != fVar224) || (NAN(fVar205) || NAN(fVar224))) {
          fVar220 = auVar57._0_4_;
          fVar205 = auVar51._0_4_;
          bVar13 = fVar220 == fVar205;
          if ((!bVar13) || (NAN(fVar220) || NAN(fVar205))) {
            auVar20._8_4_ = 0x80000000;
            auVar20._0_8_ = 0x8000000080000000;
            auVar20._12_4_ = 0x80000000;
            auVar51 = vxorps_avx512vl(auVar51,auVar20);
            auVar210._0_4_ = auVar51._0_4_ / (fVar220 - fVar205);
            auVar210._4_12_ = auVar51._4_12_;
            auVar51 = vsubss_avx512f(auVar56,auVar210);
            auVar57 = vfmadd213ss_avx512f(auVar51,auVar53,auVar210);
            auVar51 = auVar57;
          }
          else {
            vucomiss_avx512f(auVar53);
            auVar90._16_16_ = auVar80._16_16_;
            auVar90._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar89._4_28_ = auVar90._4_28_;
            auVar89._0_4_ = (uint)bVar13 * iVar265 + (uint)!bVar13 * 0x7f800000;
            auVar57 = auVar89._0_16_;
            auVar51 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar40 = vminss_avx(auVar40,auVar57);
          auVar39 = vmaxss_avx(auVar51,auVar39);
        }
        bVar13 = fVar219 != fVar224;
        auVar51 = vminss_avx512f(auVar40,auVar56);
        auVar92._16_16_ = auVar80._16_16_;
        auVar92._0_16_ = auVar40;
        auVar91._4_28_ = auVar92._4_28_;
        auVar91._0_4_ = (uint)bVar13 * auVar51._0_4_ + (uint)!bVar13 * auVar40._0_4_;
        auVar40 = vmaxss_avx512f(auVar56,auVar39);
        auVar94._16_16_ = auVar80._16_16_;
        auVar94._0_16_ = auVar39;
        auVar93._4_28_ = auVar94._4_28_;
        auVar93._0_4_ = (uint)bVar13 * auVar40._0_4_ + (uint)!bVar13 * auVar39._0_4_;
        auVar39 = vmaxss_avx512f(auVar53,auVar91._0_16_);
        auVar40 = vminss_avx512f(auVar93._0_16_,auVar56);
        bVar13 = true;
        if (auVar40._0_4_ < auVar39._0_4_) {
          auVar259 = ZEXT1664(auVar258);
          auVar95._16_16_ = auVar80._16_16_;
          auVar80 = auVar95;
        }
        else {
          auVar58 = vmaxss_avx512f(auVar53,ZEXT416((uint)(auVar39._0_4_ + -0.1)));
          auVar44 = vminss_avx512f(ZEXT416((uint)(auVar40._0_4_ + 0.1)),auVar56);
          auVar109._0_8_ = auVar54._0_8_;
          auVar109._8_8_ = auVar109._0_8_;
          auVar200._8_8_ = auVar156._0_8_;
          auVar200._0_8_ = auVar156._0_8_;
          auVar211._8_8_ = auVar47._0_8_;
          auVar211._0_8_ = auVar47._0_8_;
          auVar39 = vshufpd_avx(auVar156,auVar156,3);
          auVar40 = vshufpd_avx(auVar47,auVar47,3);
          auVar51 = vshufps_avx(auVar58,auVar44,0);
          auVar60 = vsubps_avx512vl(auVar103,auVar51);
          fVar224 = auVar51._0_4_;
          auVar243._0_4_ = fVar224 * auVar42._0_4_;
          fVar205 = auVar51._4_4_;
          auVar243._4_4_ = fVar205 * auVar42._4_4_;
          fVar219 = auVar51._8_4_;
          auVar243._8_4_ = fVar219 * auVar42._8_4_;
          fVar220 = auVar51._12_4_;
          auVar243._12_4_ = fVar220 * auVar42._12_4_;
          auVar157._0_4_ = fVar224 * auVar39._0_4_;
          auVar157._4_4_ = fVar205 * auVar39._4_4_;
          auVar157._8_4_ = fVar219 * auVar39._8_4_;
          auVar157._12_4_ = fVar220 * auVar39._12_4_;
          auVar170._0_4_ = fVar224 * auVar40._0_4_;
          auVar170._4_4_ = fVar205 * auVar40._4_4_;
          auVar170._8_4_ = fVar219 * auVar40._8_4_;
          auVar170._12_4_ = fVar220 * auVar40._12_4_;
          auVar128._0_4_ = fVar224 * auVar43._0_4_;
          auVar128._4_4_ = fVar205 * auVar43._4_4_;
          auVar128._8_4_ = fVar219 * auVar43._8_4_;
          auVar128._12_4_ = fVar220 * auVar43._12_4_;
          auVar57 = vfmadd231ps_fma(auVar243,auVar60,auVar109);
          auVar61 = vfmadd231ps_fma(auVar157,auVar60,auVar200);
          auVar59 = vfmadd231ps_fma(auVar170,auVar60,auVar211);
          auVar60 = vfmadd231ps_fma(auVar128,auVar60,ZEXT816(0));
          auVar39 = vsubss_avx512f(auVar56,auVar58);
          auVar40 = vmovshdup_avx512vl(auVar258);
          auVar46 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar40._0_4_ * auVar58._0_4_)),auVar258,
                                        auVar39);
          auVar39 = vsubss_avx512f(auVar56,auVar44);
          auVar47 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar44._0_4_ * auVar40._0_4_)),auVar258,
                                        auVar39);
          auVar58 = vdivss_avx512f(auVar56,auVar55);
          auVar39 = vsubps_avx(auVar61,auVar57);
          auVar54 = auVar261._0_16_;
          auVar51 = vmulps_avx512vl(auVar39,auVar54);
          auVar39 = vsubps_avx(auVar59,auVar61);
          auVar55 = vmulps_avx512vl(auVar39,auVar54);
          auVar39 = vsubps_avx(auVar60,auVar59);
          auVar39 = vmulps_avx512vl(auVar39,auVar54);
          auVar40 = vminps_avx(auVar55,auVar39);
          auVar39 = vmaxps_avx(auVar55,auVar39);
          auVar40 = vminps_avx(auVar51,auVar40);
          auVar39 = vmaxps_avx(auVar51,auVar39);
          auVar51 = vshufpd_avx(auVar40,auVar40,3);
          auVar55 = vshufpd_avx(auVar39,auVar39,3);
          auVar40 = vminps_avx(auVar40,auVar51);
          auVar39 = vmaxps_avx(auVar39,auVar55);
          fVar224 = auVar58._0_4_;
          auVar193._0_4_ = fVar224 * auVar40._0_4_;
          auVar193._4_4_ = fVar224 * auVar40._4_4_;
          auVar193._8_4_ = fVar224 * auVar40._8_4_;
          auVar193._12_4_ = fVar224 * auVar40._12_4_;
          auVar179._0_4_ = fVar224 * auVar39._0_4_;
          auVar179._4_4_ = fVar224 * auVar39._4_4_;
          auVar179._8_4_ = fVar224 * auVar39._8_4_;
          auVar179._12_4_ = fVar224 * auVar39._12_4_;
          auVar58 = vdivss_avx512f(auVar56,ZEXT416((uint)(auVar47._0_4_ - auVar46._0_4_)));
          auVar39 = vshufpd_avx(auVar57,auVar57,3);
          auVar40 = vshufpd_avx(auVar61,auVar61,3);
          auVar51 = vshufpd_avx(auVar59,auVar59,3);
          auVar55 = vshufpd_avx(auVar60,auVar60,3);
          auVar39 = vsubps_avx(auVar39,auVar57);
          auVar57 = vsubps_avx(auVar40,auVar61);
          auVar61 = vsubps_avx(auVar51,auVar59);
          auVar55 = vsubps_avx(auVar55,auVar60);
          auVar40 = vminps_avx(auVar39,auVar57);
          auVar39 = vmaxps_avx(auVar39,auVar57);
          auVar51 = vminps_avx(auVar61,auVar55);
          auVar51 = vminps_avx(auVar40,auVar51);
          auVar40 = vmaxps_avx(auVar61,auVar55);
          auVar39 = vmaxps_avx(auVar39,auVar40);
          fVar224 = auVar58._0_4_;
          auVar212._0_4_ = fVar224 * auVar51._0_4_;
          auVar212._4_4_ = fVar224 * auVar51._4_4_;
          auVar212._8_4_ = fVar224 * auVar51._8_4_;
          auVar212._12_4_ = fVar224 * auVar51._12_4_;
          auVar226._0_4_ = fVar224 * auVar39._0_4_;
          auVar226._4_4_ = fVar224 * auVar39._4_4_;
          auVar226._8_4_ = fVar224 * auVar39._8_4_;
          auVar226._12_4_ = fVar224 * auVar39._12_4_;
          auVar45 = vinsertps_avx512f(auVar95._0_16_,auVar46,0x10);
          auVar57 = vinsertps_avx(auVar52,auVar47,0x10);
          auVar102._0_4_ = auVar45._0_4_ + auVar57._0_4_;
          auVar102._4_4_ = auVar45._4_4_ + auVar57._4_4_;
          auVar102._8_4_ = auVar45._8_4_ + auVar57._8_4_;
          auVar102._12_4_ = auVar45._12_4_ + auVar57._12_4_;
          auVar19._8_4_ = 0x3f000000;
          auVar19._0_8_ = 0x3f0000003f000000;
          auVar19._12_4_ = 0x3f000000;
          auVar43 = vmulps_avx512vl(auVar102,auVar19);
          auVar51 = vshufps_avx(auVar43,auVar43,0x54);
          uVar98 = auVar43._0_4_;
          auVar119._4_4_ = uVar98;
          auVar119._0_4_ = uVar98;
          auVar119._8_4_ = uVar98;
          auVar119._12_4_ = uVar98;
          auVar40 = vfmadd213ps_fma(local_158,auVar119,auVar50);
          auVar55 = vfmadd213ps_fma(local_168,auVar119,auVar41);
          auVar61 = vfmadd213ps_avx512vl(local_178,auVar119,auVar48);
          auVar39 = vsubps_avx(auVar55,auVar40);
          auVar40 = vfmadd213ps_fma(auVar39,auVar119,auVar40);
          auVar39 = vsubps_avx(auVar61,auVar55);
          auVar39 = vfmadd213ps_fma(auVar39,auVar119,auVar55);
          auVar39 = vsubps_avx(auVar39,auVar40);
          auVar40 = vfmadd231ps_fma(auVar40,auVar39,auVar119);
          auVar59 = vmulps_avx512vl(auVar39,auVar54);
          auVar234._8_8_ = auVar40._0_8_;
          auVar234._0_8_ = auVar40._0_8_;
          auVar39 = vshufpd_avx(auVar40,auVar40,3);
          auVar40 = vshufps_avx(auVar43,auVar43,0x55);
          auVar55 = vsubps_avx(auVar39,auVar234);
          auVar61 = vfmadd231ps_fma(auVar234,auVar40,auVar55);
          auVar251._8_8_ = auVar59._0_8_;
          auVar251._0_8_ = auVar59._0_8_;
          auVar39 = vshufpd_avx(auVar59,auVar59,3);
          auVar39 = vsubps_avx(auVar39,auVar251);
          auVar40 = vfmadd213ps_fma(auVar39,auVar40,auVar251);
          auVar120._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
          auVar120._8_4_ = auVar55._8_4_ ^ 0x80000000;
          auVar120._12_4_ = auVar55._12_4_ ^ 0x80000000;
          auVar39 = vmovshdup_avx(auVar40);
          auVar252._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
          auVar252._8_4_ = auVar39._8_4_ ^ 0x80000000;
          auVar252._12_4_ = auVar39._12_4_ ^ 0x80000000;
          auVar59 = vmovshdup_avx512vl(auVar55);
          auVar60 = vpermt2ps_avx512vl(auVar252,ZEXT416(5),auVar55);
          auVar39 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar39._0_4_ * auVar55._0_4_)),auVar40,
                                        auVar59);
          auVar40 = vpermt2ps_avx512vl(auVar40,SUB6416(ZEXT464(4),0),auVar120);
          auVar129._0_4_ = auVar39._0_4_;
          auVar129._4_4_ = auVar129._0_4_;
          auVar129._8_4_ = auVar129._0_4_;
          auVar129._12_4_ = auVar129._0_4_;
          auVar39 = vdivps_avx(auVar60,auVar129);
          auVar40 = vdivps_avx(auVar40,auVar129);
          fVar205 = auVar61._0_4_;
          auVar55 = vshufps_avx(auVar61,auVar61,0x55);
          fVar224 = auVar40._0_4_;
          auVar235._0_4_ = fVar205 * auVar39._0_4_ + auVar55._0_4_ * fVar224;
          auVar235._4_4_ = fVar205 * auVar39._4_4_ + auVar55._4_4_ * auVar40._4_4_;
          auVar235._8_4_ = fVar205 * auVar39._8_4_ + auVar55._8_4_ * auVar40._8_4_;
          auVar235._12_4_ = fVar205 * auVar39._12_4_ + auVar55._12_4_ * auVar40._12_4_;
          auVar44 = vsubps_avx(auVar51,auVar235);
          auVar61 = vmovshdup_avx(auVar39);
          auVar51 = vinsertps_avx(auVar193,auVar212,0x1c);
          auVar253._0_4_ = auVar61._0_4_ * auVar51._0_4_;
          auVar253._4_4_ = auVar61._4_4_ * auVar51._4_4_;
          auVar253._8_4_ = auVar61._8_4_ * auVar51._8_4_;
          auVar253._12_4_ = auVar61._12_4_ * auVar51._12_4_;
          auVar55 = vinsertps_avx(auVar179,auVar226,0x1c);
          auVar236._0_4_ = auVar61._0_4_ * auVar55._0_4_;
          auVar236._4_4_ = auVar61._4_4_ * auVar55._4_4_;
          auVar236._8_4_ = auVar61._8_4_ * auVar55._8_4_;
          auVar236._12_4_ = auVar61._12_4_ * auVar55._12_4_;
          auVar42 = vminps_avx512vl(auVar253,auVar236);
          auVar60 = vmaxps_avx(auVar236,auVar253);
          auVar58 = vmovshdup_avx(auVar40);
          auVar61 = vinsertps_avx(auVar212,auVar193,0x4c);
          auVar213._0_4_ = auVar58._0_4_ * auVar61._0_4_;
          auVar213._4_4_ = auVar58._4_4_ * auVar61._4_4_;
          auVar213._8_4_ = auVar58._8_4_ * auVar61._8_4_;
          auVar213._12_4_ = auVar58._12_4_ * auVar61._12_4_;
          auVar59 = vinsertps_avx(auVar226,auVar179,0x4c);
          auVar227._0_4_ = auVar58._0_4_ * auVar59._0_4_;
          auVar227._4_4_ = auVar58._4_4_ * auVar59._4_4_;
          auVar227._8_4_ = auVar58._8_4_ * auVar59._8_4_;
          auVar227._12_4_ = auVar58._12_4_ * auVar59._12_4_;
          auVar58 = vminps_avx(auVar213,auVar227);
          auVar42 = vaddps_avx512vl(auVar42,auVar58);
          auVar58 = vmaxps_avx(auVar227,auVar213);
          auVar214._0_4_ = auVar60._0_4_ + auVar58._0_4_;
          auVar214._4_4_ = auVar60._4_4_ + auVar58._4_4_;
          auVar214._8_4_ = auVar60._8_4_ + auVar58._8_4_;
          auVar214._12_4_ = auVar60._12_4_ + auVar58._12_4_;
          auVar228._8_8_ = 0x3f80000000000000;
          auVar228._0_8_ = 0x3f80000000000000;
          auVar60 = vsubps_avx(auVar228,auVar214);
          auVar58 = vsubps_avx(auVar228,auVar42);
          auVar42 = vsubps_avx(auVar45,auVar43);
          auVar43 = vsubps_avx(auVar57,auVar43);
          fVar222 = auVar42._0_4_;
          auVar254._0_4_ = fVar222 * auVar60._0_4_;
          fVar223 = auVar42._4_4_;
          auVar254._4_4_ = fVar223 * auVar60._4_4_;
          fVar122 = auVar42._8_4_;
          auVar254._8_4_ = fVar122 * auVar60._8_4_;
          fVar133 = auVar42._12_4_;
          auVar254._12_4_ = fVar133 * auVar60._12_4_;
          auVar49 = vbroadcastss_avx512vl(auVar39);
          auVar51 = vmulps_avx512vl(auVar49,auVar51);
          auVar55 = vmulps_avx512vl(auVar49,auVar55);
          auVar49 = vminps_avx512vl(auVar51,auVar55);
          auVar51 = vmaxps_avx(auVar55,auVar51);
          auVar194._0_4_ = fVar224 * auVar61._0_4_;
          auVar194._4_4_ = fVar224 * auVar61._4_4_;
          auVar194._8_4_ = fVar224 * auVar61._8_4_;
          auVar194._12_4_ = fVar224 * auVar61._12_4_;
          auVar180._0_4_ = fVar224 * auVar59._0_4_;
          auVar180._4_4_ = fVar224 * auVar59._4_4_;
          auVar180._8_4_ = fVar224 * auVar59._8_4_;
          auVar180._12_4_ = fVar224 * auVar59._12_4_;
          auVar55 = vminps_avx(auVar194,auVar180);
          auVar61 = vaddps_avx512vl(auVar49,auVar55);
          auVar59 = vmulps_avx512vl(auVar42,auVar58);
          fVar205 = auVar43._0_4_;
          auVar215._0_4_ = fVar205 * auVar60._0_4_;
          fVar219 = auVar43._4_4_;
          auVar215._4_4_ = fVar219 * auVar60._4_4_;
          fVar220 = auVar43._8_4_;
          auVar215._8_4_ = fVar220 * auVar60._8_4_;
          fVar221 = auVar43._12_4_;
          auVar215._12_4_ = fVar221 * auVar60._12_4_;
          auVar229._0_4_ = fVar205 * auVar58._0_4_;
          auVar229._4_4_ = fVar219 * auVar58._4_4_;
          auVar229._8_4_ = fVar220 * auVar58._8_4_;
          auVar229._12_4_ = fVar221 * auVar58._12_4_;
          auVar55 = vmaxps_avx(auVar180,auVar194);
          auVar181._0_4_ = auVar51._0_4_ + auVar55._0_4_;
          auVar181._4_4_ = auVar51._4_4_ + auVar55._4_4_;
          auVar181._8_4_ = auVar51._8_4_ + auVar55._8_4_;
          auVar181._12_4_ = auVar51._12_4_ + auVar55._12_4_;
          auVar195._8_8_ = 0x3f800000;
          auVar195._0_8_ = 0x3f800000;
          auVar51 = vsubps_avx(auVar195,auVar181);
          auVar55 = vsubps_avx(auVar195,auVar61);
          auVar244._0_4_ = fVar222 * auVar51._0_4_;
          auVar244._4_4_ = fVar223 * auVar51._4_4_;
          auVar244._8_4_ = fVar122 * auVar51._8_4_;
          auVar244._12_4_ = fVar133 * auVar51._12_4_;
          auVar237._0_4_ = fVar222 * auVar55._0_4_;
          auVar237._4_4_ = fVar223 * auVar55._4_4_;
          auVar237._8_4_ = fVar122 * auVar55._8_4_;
          auVar237._12_4_ = fVar133 * auVar55._12_4_;
          auVar182._0_4_ = fVar205 * auVar51._0_4_;
          auVar182._4_4_ = fVar219 * auVar51._4_4_;
          auVar182._8_4_ = fVar220 * auVar51._8_4_;
          auVar182._12_4_ = fVar221 * auVar51._12_4_;
          auVar196._0_4_ = fVar205 * auVar55._0_4_;
          auVar196._4_4_ = fVar219 * auVar55._4_4_;
          auVar196._8_4_ = fVar220 * auVar55._8_4_;
          auVar196._12_4_ = fVar221 * auVar55._12_4_;
          auVar51 = vminps_avx(auVar244,auVar237);
          auVar55 = vminps_avx(auVar182,auVar196);
          auVar61 = vminps_avx(auVar51,auVar55);
          auVar51 = vmaxps_avx(auVar237,auVar244);
          auVar55 = vmaxps_avx(auVar196,auVar182);
          auVar55 = vmaxps_avx(auVar55,auVar51);
          auVar60 = vminps_avx512vl(auVar254,auVar59);
          auVar51 = vminps_avx(auVar215,auVar229);
          auVar51 = vminps_avx(auVar60,auVar51);
          auVar51 = vhaddps_avx(auVar61,auVar51);
          auVar59 = vmaxps_avx512vl(auVar59,auVar254);
          auVar61 = vmaxps_avx(auVar229,auVar215);
          auVar61 = vmaxps_avx(auVar61,auVar59);
          auVar55 = vhaddps_avx(auVar55,auVar61);
          auVar51 = vshufps_avx(auVar51,auVar51,0xe8);
          auVar55 = vshufps_avx(auVar55,auVar55,0xe8);
          auVar183._0_4_ = auVar51._0_4_ + auVar44._0_4_;
          auVar183._4_4_ = auVar51._4_4_ + auVar44._4_4_;
          auVar183._8_4_ = auVar51._8_4_ + auVar44._8_4_;
          auVar183._12_4_ = auVar51._12_4_ + auVar44._12_4_;
          auVar197._0_4_ = auVar55._0_4_ + auVar44._0_4_;
          auVar197._4_4_ = auVar55._4_4_ + auVar44._4_4_;
          auVar197._8_4_ = auVar55._8_4_ + auVar44._8_4_;
          auVar197._12_4_ = auVar55._12_4_ + auVar44._12_4_;
          auVar51 = vmaxps_avx(auVar45,auVar183);
          auVar55 = vminps_avx(auVar197,auVar57);
          uVar38 = vcmpps_avx512vl(auVar55,auVar51,1);
          auVar51 = vinsertps_avx512f(auVar46,auVar47,0x10);
          auVar259 = ZEXT1664(auVar51);
          if ((uVar38 & 3) == 0) {
            vucomiss_avx512f(auVar95._0_16_);
            auVar263 = ZEXT1664(auVar103);
            auVar80._0_16_ = auVar50;
            if (uVar36 < 4 && (uVar6 == 0 || lVar32 == 0)) {
              bVar13 = false;
            }
            else {
              lVar32 = 200;
              do {
                auVar55 = vsubss_avx512f(auVar56,auVar44);
                fVar220 = auVar55._0_4_;
                fVar205 = fVar220 * fVar220 * fVar220;
                fVar221 = auVar44._0_4_;
                fVar219 = fVar221 * 3.0 * fVar220 * fVar220;
                fVar220 = fVar220 * fVar221 * fVar221 * 3.0;
                auVar158._4_4_ = fVar205;
                auVar158._0_4_ = fVar205;
                auVar158._8_4_ = fVar205;
                auVar158._12_4_ = fVar205;
                auVar142._4_4_ = fVar219;
                auVar142._0_4_ = fVar219;
                auVar142._8_4_ = fVar219;
                auVar142._12_4_ = fVar219;
                auVar110._4_4_ = fVar220;
                auVar110._0_4_ = fVar220;
                auVar110._8_4_ = fVar220;
                auVar110._12_4_ = fVar220;
                fVar221 = fVar221 * fVar221 * fVar221;
                auVar171._0_4_ = (float)local_398._0_4_ * fVar221;
                auVar171._4_4_ = (float)local_398._4_4_ * fVar221;
                auVar171._8_4_ = fStack_390 * fVar221;
                auVar171._12_4_ = fStack_38c * fVar221;
                auVar55 = vfmadd231ps_fma(auVar171,auVar48,auVar110);
                auVar55 = vfmadd231ps_fma(auVar55,auVar41,auVar142);
                auVar55 = vfmadd231ps_avx512vl(auVar55,auVar50,auVar158);
                auVar111._8_8_ = auVar55._0_8_;
                auVar111._0_8_ = auVar55._0_8_;
                auVar55 = vshufpd_avx(auVar55,auVar55,3);
                auVar57 = vshufps_avx(auVar44,auVar44,0x55);
                auVar55 = vsubps_avx(auVar55,auVar111);
                auVar57 = vfmadd213ps_fma(auVar55,auVar57,auVar111);
                fVar205 = auVar57._0_4_;
                auVar55 = vshufps_avx(auVar57,auVar57,0x55);
                auVar112._0_4_ = auVar39._0_4_ * fVar205 + fVar224 * auVar55._0_4_;
                auVar112._4_4_ = auVar39._4_4_ * fVar205 + auVar40._4_4_ * auVar55._4_4_;
                auVar112._8_4_ = auVar39._8_4_ * fVar205 + auVar40._8_4_ * auVar55._8_4_;
                auVar112._12_4_ = auVar39._12_4_ * fVar205 + auVar40._12_4_ * auVar55._12_4_;
                auVar44 = vsubps_avx(auVar44,auVar112);
                auVar55 = vandps_avx512vl(auVar57,auVar262._0_16_);
                auVar80._0_16_ = vprolq_avx512vl(auVar55,0x20);
                auVar55 = vmaxss_avx(auVar80._0_16_,auVar55);
                bVar16 = auVar55._0_4_ <= (float)local_3a8._0_4_;
                if (auVar55._0_4_ < (float)local_3a8._0_4_) {
                  auVar39 = vucomiss_avx512f(auVar53);
                  if (bVar16) {
                    auVar40 = vucomiss_avx512f(auVar39);
                    auVar264 = ZEXT1664(auVar40);
                    if (bVar16) {
                      vmovshdup_avx(auVar39);
                      auVar40 = vucomiss_avx512f(auVar53);
                      if (bVar16) {
                        auVar55 = vucomiss_avx512f(auVar40);
                        auVar264 = ZEXT1664(auVar55);
                        if (bVar16) {
                          auVar56 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar43 = vinsertps_avx(auVar56,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar56 = vdpps_avx(auVar43,local_188,0x7f);
                          auVar57 = vdpps_avx(auVar43,local_198,0x7f);
                          auVar61 = vdpps_avx(auVar43,local_1a8,0x7f);
                          auVar59 = vdpps_avx(auVar43,local_1b8,0x7f);
                          auVar60 = vdpps_avx(auVar43,local_1c8,0x7f);
                          auVar58 = vdpps_avx(auVar43,local_1d8,0x7f);
                          auVar42 = vdpps_avx(auVar43,local_1e8,0x7f);
                          auVar43 = vdpps_avx(auVar43,local_1f8,0x7f);
                          auVar44 = vsubss_avx512f(auVar55,auVar40);
                          fVar220 = auVar40._0_4_;
                          auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar220 * auVar60._0_4_)),auVar44
                                                    ,auVar56);
                          auVar56 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * fVar220)),auVar44
                                                    ,auVar57);
                          auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * fVar220)),auVar44
                                                    ,auVar61);
                          auVar61 = vfmadd231ss_fma(ZEXT416((uint)(fVar220 * auVar43._0_4_)),auVar44
                                                    ,auVar59);
                          auVar80._0_16_ = vsubss_avx512f(auVar55,auVar39);
                          auVar201._0_4_ = auVar80._0_4_;
                          fVar224 = auVar201._0_4_ * auVar201._0_4_ * auVar201._0_4_;
                          local_f8 = auVar39._0_4_;
                          fVar205 = local_f8 * 3.0 * auVar201._0_4_ * auVar201._0_4_;
                          fVar219 = auVar201._0_4_ * local_f8 * local_f8 * 3.0;
                          fVar222 = local_f8 * local_f8 * local_f8;
                          auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * auVar61._0_4_)),
                                                    ZEXT416((uint)fVar219),auVar57);
                          auVar55 = vfmadd231ss_fma(auVar55,ZEXT416((uint)fVar205),auVar56);
                          auVar40 = vfmadd231ss_fma(auVar55,ZEXT416((uint)fVar224),auVar40);
                          fVar221 = auVar40._0_4_;
                          if ((fVar97 <= fVar221) &&
                             (fVar223 = *(float *)(ray + k * 4 + 0x80), fVar221 <= fVar223)) {
                            local_e8 = vshufps_avx(auVar39,auVar39,0x55);
                            auVar56 = vsubps_avx512vl(auVar103,local_e8);
                            fVar122 = local_e8._0_4_;
                            auVar216._0_4_ = fVar122 * (float)local_248._0_4_;
                            fVar133 = local_e8._4_4_;
                            auVar216._4_4_ = fVar133 * (float)local_248._4_4_;
                            fVar134 = local_e8._8_4_;
                            auVar216._8_4_ = fVar134 * fStack_240;
                            fVar135 = local_e8._12_4_;
                            auVar216._12_4_ = fVar135 * fStack_23c;
                            auVar230._0_4_ = fVar122 * (float)local_258._0_4_;
                            auVar230._4_4_ = fVar133 * (float)local_258._4_4_;
                            auVar230._8_4_ = fVar134 * fStack_250;
                            auVar230._12_4_ = fVar135 * fStack_24c;
                            auVar238._0_4_ = fVar122 * (float)local_268._0_4_;
                            auVar238._4_4_ = fVar133 * (float)local_268._4_4_;
                            auVar238._8_4_ = fVar134 * fStack_260;
                            auVar238._12_4_ = fVar135 * fStack_25c;
                            auVar245._0_4_ = fVar122 * (float)local_278._0_4_;
                            auVar245._4_4_ = fVar133 * (float)local_278._4_4_;
                            auVar245._8_4_ = fVar134 * fStack_270;
                            auVar245._12_4_ = fVar135 * fStack_26c;
                            auVar39 = vfmadd231ps_fma(auVar216,auVar56,local_208);
                            auVar40 = vfmadd231ps_fma(auVar230,auVar56,local_218);
                            auVar55 = vfmadd231ps_fma(auVar238,auVar56,local_228);
                            auVar56 = vfmadd231ps_fma(auVar245,auVar56,local_238);
                            auVar39 = vsubps_avx(auVar40,auVar39);
                            auVar40 = vsubps_avx(auVar55,auVar40);
                            auVar55 = vsubps_avx(auVar56,auVar55);
                            auVar246._0_4_ = local_f8 * auVar40._0_4_;
                            auVar246._4_4_ = local_f8 * auVar40._4_4_;
                            auVar246._8_4_ = local_f8 * auVar40._8_4_;
                            auVar246._12_4_ = local_f8 * auVar40._12_4_;
                            auVar201._4_4_ = auVar201._0_4_;
                            auVar201._8_4_ = auVar201._0_4_;
                            auVar201._12_4_ = auVar201._0_4_;
                            auVar39 = vfmadd231ps_fma(auVar246,auVar201,auVar39);
                            auVar217._0_4_ = local_f8 * auVar55._0_4_;
                            auVar217._4_4_ = local_f8 * auVar55._4_4_;
                            auVar217._8_4_ = local_f8 * auVar55._8_4_;
                            auVar217._12_4_ = local_f8 * auVar55._12_4_;
                            auVar40 = vfmadd231ps_fma(auVar217,auVar201,auVar40);
                            auVar218._0_4_ = local_f8 * auVar40._0_4_;
                            auVar218._4_4_ = local_f8 * auVar40._4_4_;
                            auVar218._8_4_ = local_f8 * auVar40._8_4_;
                            auVar218._12_4_ = local_f8 * auVar40._12_4_;
                            auVar39 = vfmadd231ps_fma(auVar218,auVar201,auVar39);
                            auVar80._0_16_ = vmulps_avx512vl(auVar39,auVar54);
                            pGVar7 = (context->scene->geometries).items[uVar28].ptr;
                            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                              auVar184._0_4_ = fVar222 * (float)local_2b8._0_4_;
                              auVar184._4_4_ = fVar222 * (float)local_2b8._4_4_;
                              auVar184._8_4_ = fVar222 * fStack_2b0;
                              auVar184._12_4_ = fVar222 * fStack_2ac;
                              auVar172._4_4_ = fVar219;
                              auVar172._0_4_ = fVar219;
                              auVar172._8_4_ = fVar219;
                              auVar172._12_4_ = fVar219;
                              auVar39 = vfmadd132ps_fma(auVar172,auVar184,local_2a8);
                              auVar159._4_4_ = fVar205;
                              auVar159._0_4_ = fVar205;
                              auVar159._8_4_ = fVar205;
                              auVar159._12_4_ = fVar205;
                              auVar39 = vfmadd132ps_fma(auVar159,auVar39,local_298);
                              auVar143._4_4_ = fVar224;
                              auVar143._0_4_ = fVar224;
                              auVar143._8_4_ = fVar224;
                              auVar143._12_4_ = fVar224;
                              auVar55 = vfmadd132ps_fma(auVar143,auVar39,local_288);
                              auVar39 = vshufps_avx(auVar55,auVar55,0xc9);
                              auVar40 = vshufps_avx(auVar80._0_16_,auVar80._0_16_,0xc9);
                              auVar144._0_4_ = auVar55._0_4_ * auVar40._0_4_;
                              auVar144._4_4_ = auVar55._4_4_ * auVar40._4_4_;
                              auVar144._8_4_ = auVar55._8_4_ * auVar40._8_4_;
                              auVar144._12_4_ = auVar55._12_4_ * auVar40._12_4_;
                              auVar39 = vfmsub231ps_fma(auVar144,auVar80._0_16_,auVar39);
                              local_108 = auVar39._0_4_;
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                *(float *)(ray + k * 4 + 0x80) = fVar221;
                                uVar98 = vextractps_avx(auVar39,1);
                                *(undefined4 *)(ray + k * 4 + 0xc0) = uVar98;
                                uVar98 = vextractps_avx(auVar39,2);
                                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar98;
                                *(undefined4 *)(ray + k * 4 + 0xe0) = local_108;
                                *(float *)(ray + k * 4 + 0xf0) = local_f8;
                                *(float *)(ray + k * 4 + 0x100) = fVar220;
                                *(uint *)(ray + k * 4 + 0x110) = uVar33;
                                *(int *)(ray + k * 4 + 0x120) = (int)uVar28;
                                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                              }
                              else {
                                auVar40 = vshufps_avx(auVar39,auVar39,0x55);
                                local_118 = vshufps_avx(auVar39,auVar39,0xaa);
                                local_128[0] = (RTCHitN)auVar40[0];
                                local_128[1] = (RTCHitN)auVar40[1];
                                local_128[2] = (RTCHitN)auVar40[2];
                                local_128[3] = (RTCHitN)auVar40[3];
                                local_128[4] = (RTCHitN)auVar40[4];
                                local_128[5] = (RTCHitN)auVar40[5];
                                local_128[6] = (RTCHitN)auVar40[6];
                                local_128[7] = (RTCHitN)auVar40[7];
                                local_128[8] = (RTCHitN)auVar40[8];
                                local_128[9] = (RTCHitN)auVar40[9];
                                local_128[10] = (RTCHitN)auVar40[10];
                                local_128[0xb] = (RTCHitN)auVar40[0xb];
                                local_128[0xc] = (RTCHitN)auVar40[0xc];
                                local_128[0xd] = (RTCHitN)auVar40[0xd];
                                local_128[0xe] = (RTCHitN)auVar40[0xe];
                                local_128[0xf] = (RTCHitN)auVar40[0xf];
                                uStack_104 = local_108;
                                uStack_100 = local_108;
                                uStack_fc = local_108;
                                fStack_f4 = local_f8;
                                fStack_f0 = local_f8;
                                fStack_ec = local_f8;
                                local_d8 = local_2e8._0_8_;
                                uStack_d0 = local_2e8._8_8_;
                                local_c8 = local_2d8;
                                vpcmpeqd_avx2(ZEXT1632(local_2d8),ZEXT1632(local_2d8));
                                uStack_b4 = context->user->instID[0];
                                local_b8 = uStack_b4;
                                uStack_b0 = uStack_b4;
                                uStack_ac = uStack_b4;
                                uStack_a8 = context->user->instPrimID[0];
                                uStack_a4 = uStack_a8;
                                uStack_a0 = uStack_a8;
                                uStack_9c = uStack_a8;
                                *(float *)(ray + k * 4 + 0x80) = fVar221;
                                local_3f8 = local_2f8._0_8_;
                                uStack_3f0 = local_2f8._8_8_;
                                local_3d8.valid = (int *)&local_3f8;
                                local_3d8.geometryUserPtr = pGVar7->userPtr;
                                local_3d8.context = context->user;
                                local_3d8.hit = local_128;
                                local_3d8.N = 4;
                                local_3d8.ray = (RTCRayN *)ray;
                                if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                  local_3e8 = uVar28;
                                  (*pGVar7->intersectionFilterN)(&local_3d8);
                                  in_ZMM22 = ZEXT464(0x38d1b717);
                                  in_ZMM19 = ZEXT464(0x3e2aaaab);
                                  auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar260 = ZEXT3264(auVar80);
                                  auVar264 = ZEXT464(0x3f800000);
                                  auVar39 = vxorps_avx512vl(auVar53,auVar53);
                                  auVar266 = ZEXT1664(auVar39);
                                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar262 = ZEXT1664(auVar39);
                                  uVar28 = local_3e8;
                                }
                                auVar39 = auVar266._0_16_;
                                auVar24._8_8_ = uStack_3f0;
                                auVar24._0_8_ = local_3f8;
                                uVar38 = vptestmd_avx512vl(auVar24,auVar24);
                                if ((uVar38 & 0xf) == 0) {
LAB_01c21cf9:
                                  *(float *)(ray + k * 4 + 0x80) = fVar223;
                                }
                                else {
                                  p_Var12 = context->args->filter;
                                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var12)(&local_3d8);
                                    in_ZMM22 = ZEXT464(0x38d1b717);
                                    in_ZMM19 = ZEXT464(0x3e2aaaab);
                                    auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar260 = ZEXT3264(auVar80);
                                    auVar264 = ZEXT464(0x3f800000);
                                    auVar39 = vxorps_avx512vl(auVar39,auVar39);
                                    auVar266 = ZEXT1664(auVar39);
                                    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar262 = ZEXT1664(auVar39);
                                  }
                                  auVar25._8_8_ = uStack_3f0;
                                  auVar25._0_8_ = local_3f8;
                                  uVar38 = vptestmd_avx512vl(auVar25,auVar25);
                                  uVar38 = uVar38 & 0xf;
                                  bVar26 = (byte)uVar38;
                                  if (bVar26 == 0) goto LAB_01c21cf9;
                                  iVar96 = *(int *)(local_3d8.hit + 4);
                                  iVar265 = *(int *)(local_3d8.hit + 8);
                                  iVar23 = *(int *)(local_3d8.hit + 0xc);
                                  bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
                                  bVar14 = (bool)((byte)(uVar38 >> 2) & 1);
                                  bVar15 = SUB81(uVar38 >> 3,0);
                                  *(uint *)(local_3d8.ray + 0xc0) =
                                       (uint)(bVar26 & 1) * *(int *)local_3d8.hit |
                                       (uint)!(bool)(bVar26 & 1) * *(int *)(local_3d8.ray + 0xc0);
                                  *(uint *)(local_3d8.ray + 0xc4) =
                                       (uint)bVar16 * iVar96 |
                                       (uint)!bVar16 * *(int *)(local_3d8.ray + 0xc4);
                                  *(uint *)(local_3d8.ray + 200) =
                                       (uint)bVar14 * iVar265 |
                                       (uint)!bVar14 * *(int *)(local_3d8.ray + 200);
                                  *(uint *)(local_3d8.ray + 0xcc) =
                                       (uint)bVar15 * iVar23 |
                                       (uint)!bVar15 * *(int *)(local_3d8.ray + 0xcc);
                                  iVar96 = *(int *)(local_3d8.hit + 0x14);
                                  iVar265 = *(int *)(local_3d8.hit + 0x18);
                                  iVar23 = *(int *)(local_3d8.hit + 0x1c);
                                  bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
                                  bVar14 = (bool)((byte)(uVar38 >> 2) & 1);
                                  bVar15 = SUB81(uVar38 >> 3,0);
                                  *(uint *)(local_3d8.ray + 0xd0) =
                                       (uint)(bVar26 & 1) * *(int *)(local_3d8.hit + 0x10) |
                                       (uint)!(bool)(bVar26 & 1) * *(int *)(local_3d8.ray + 0xd0);
                                  *(uint *)(local_3d8.ray + 0xd4) =
                                       (uint)bVar16 * iVar96 |
                                       (uint)!bVar16 * *(int *)(local_3d8.ray + 0xd4);
                                  *(uint *)(local_3d8.ray + 0xd8) =
                                       (uint)bVar14 * iVar265 |
                                       (uint)!bVar14 * *(int *)(local_3d8.ray + 0xd8);
                                  *(uint *)(local_3d8.ray + 0xdc) =
                                       (uint)bVar15 * iVar23 |
                                       (uint)!bVar15 * *(int *)(local_3d8.ray + 0xdc);
                                  iVar96 = *(int *)(local_3d8.hit + 0x24);
                                  iVar265 = *(int *)(local_3d8.hit + 0x28);
                                  iVar23 = *(int *)(local_3d8.hit + 0x2c);
                                  bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
                                  bVar14 = (bool)((byte)(uVar38 >> 2) & 1);
                                  bVar15 = SUB81(uVar38 >> 3,0);
                                  *(uint *)(local_3d8.ray + 0xe0) =
                                       (uint)(bVar26 & 1) * *(int *)(local_3d8.hit + 0x20) |
                                       (uint)!(bool)(bVar26 & 1) * *(int *)(local_3d8.ray + 0xe0);
                                  *(uint *)(local_3d8.ray + 0xe4) =
                                       (uint)bVar16 * iVar96 |
                                       (uint)!bVar16 * *(int *)(local_3d8.ray + 0xe4);
                                  *(uint *)(local_3d8.ray + 0xe8) =
                                       (uint)bVar14 * iVar265 |
                                       (uint)!bVar14 * *(int *)(local_3d8.ray + 0xe8);
                                  *(uint *)(local_3d8.ray + 0xec) =
                                       (uint)bVar15 * iVar23 |
                                       (uint)!bVar15 * *(int *)(local_3d8.ray + 0xec);
                                  iVar96 = *(int *)(local_3d8.hit + 0x34);
                                  iVar265 = *(int *)(local_3d8.hit + 0x38);
                                  iVar23 = *(int *)(local_3d8.hit + 0x3c);
                                  bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
                                  bVar14 = (bool)((byte)(uVar38 >> 2) & 1);
                                  bVar15 = SUB81(uVar38 >> 3,0);
                                  *(uint *)(local_3d8.ray + 0xf0) =
                                       (uint)(bVar26 & 1) * *(int *)(local_3d8.hit + 0x30) |
                                       (uint)!(bool)(bVar26 & 1) * *(int *)(local_3d8.ray + 0xf0);
                                  *(uint *)(local_3d8.ray + 0xf4) =
                                       (uint)bVar16 * iVar96 |
                                       (uint)!bVar16 * *(int *)(local_3d8.ray + 0xf4);
                                  *(uint *)(local_3d8.ray + 0xf8) =
                                       (uint)bVar14 * iVar265 |
                                       (uint)!bVar14 * *(int *)(local_3d8.ray + 0xf8);
                                  *(uint *)(local_3d8.ray + 0xfc) =
                                       (uint)bVar15 * iVar23 |
                                       (uint)!bVar15 * *(int *)(local_3d8.ray + 0xfc);
                                  iVar96 = *(int *)(local_3d8.hit + 0x44);
                                  iVar265 = *(int *)(local_3d8.hit + 0x48);
                                  iVar23 = *(int *)(local_3d8.hit + 0x4c);
                                  bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
                                  bVar14 = (bool)((byte)(uVar38 >> 2) & 1);
                                  bVar15 = SUB81(uVar38 >> 3,0);
                                  *(uint *)(local_3d8.ray + 0x100) =
                                       (uint)(bVar26 & 1) * *(int *)(local_3d8.hit + 0x40) |
                                       (uint)!(bool)(bVar26 & 1) * *(int *)(local_3d8.ray + 0x100);
                                  *(uint *)(local_3d8.ray + 0x104) =
                                       (uint)bVar16 * iVar96 |
                                       (uint)!bVar16 * *(int *)(local_3d8.ray + 0x104);
                                  *(uint *)(local_3d8.ray + 0x108) =
                                       (uint)bVar14 * iVar265 |
                                       (uint)!bVar14 * *(int *)(local_3d8.ray + 0x108);
                                  *(uint *)(local_3d8.ray + 0x10c) =
                                       (uint)bVar15 * iVar23 |
                                       (uint)!bVar15 * *(int *)(local_3d8.ray + 0x10c);
                                  auVar39 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                                (local_3d8.hit + 0x50));
                                  *(undefined1 (*) [16])(local_3d8.ray + 0x110) = auVar39;
                                  auVar39 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                                (local_3d8.hit + 0x60));
                                  *(undefined1 (*) [16])(local_3d8.ray + 0x120) = auVar39;
                                  auVar39 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                                (local_3d8.hit + 0x70));
                                  *(undefined1 (*) [16])(local_3d8.ray + 0x130) = auVar39;
                                  auVar39 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                                (local_3d8.hit + 0x80));
                                  *(undefined1 (*) [16])(local_3d8.ray + 0x140) = auVar39;
                                }
                                auVar259 = ZEXT1664(auVar51);
                                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar263 = ZEXT1664(auVar39);
                                auVar80._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar261 = ZEXT1664(auVar80._0_16_);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar32 = lVar32 + -1;
              } while (lVar32 != 0);
            }
          }
          else {
            auVar263 = ZEXT1664(auVar103);
            auVar80._0_16_ = auVar50;
          }
        }
      }
    } while (bVar13);
    auVar39 = vinsertps_avx512f(auVar95._0_16_,auVar52,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }